

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Primitive PVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined3 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined8 uVar28;
  undefined6 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  byte bVar51;
  ulong uVar52;
  ulong uVar53;
  RTCFilterFunctionN p_Var54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  bool bVar59;
  uint uVar60;
  int iVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  uint uVar65;
  short sVar66;
  undefined2 uVar103;
  float fVar67;
  float fVar104;
  float fVar105;
  vfloat_impl<4> p00;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  float fVar106;
  float fVar130;
  float fVar131;
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  float fVar143;
  float fVar145;
  vfloat4 v;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar144;
  float fVar146;
  float fVar147;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar148;
  float fVar156;
  float fVar157;
  vfloat4 v_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar158;
  float fVar171;
  float fVar172;
  vfloat4 a;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar177;
  float fVar178;
  float fVar204;
  float fVar206;
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  float fVar205;
  float fVar207;
  float fVar208;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar209;
  float fVar212;
  float fVar213;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar215;
  float fVar228;
  float fVar230;
  vfloat4 a_2;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar233;
  float fVar241;
  float fVar242;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  float fVar244;
  float fVar256;
  float fVar258;
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  float fVar257;
  float fVar259;
  float fVar260;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar273;
  float fVar276;
  vfloat4 a_1;
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  float fVar274;
  float fVar275;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar281;
  float fVar282;
  float fVar292;
  float fVar294;
  vfloat4 a_3;
  float fVar296;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  float fVar293;
  float fVar295;
  float fVar297;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar298;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_418;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined4 local_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  ulong local_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  undefined8 uStack_280;
  ulong local_278;
  Primitive *local_270;
  RTCFilterFunctionNArguments local_268;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float afStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar100 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 uVar102;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  
  PVar12 = prim[1];
  uVar52 = (ulong)(byte)PVar12;
  lVar19 = uVar52 * 0x25;
  pPVar4 = prim + lVar19 + 6;
  fVar145 = *(float *)(pPVar4 + 0xc);
  fVar148 = ((ray->org).field_0.m128[0] - *(float *)pPVar4) * fVar145;
  fVar156 = ((ray->org).field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar145;
  fVar157 = ((ray->org).field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar145;
  fVar132 = fVar145 * (ray->dir).field_0.m128[0];
  fVar143 = fVar145 * (ray->dir).field_0.m128[1];
  fVar145 = fVar145 * (ray->dir).field_0.m128[2];
  uVar13 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar120._8_4_ = 0;
  auVar120._0_8_ = uVar58;
  auVar120._12_2_ = uVar103;
  auVar120._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar134._12_4_ = auVar120._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = uVar58;
  auVar134._10_2_ = uVar103;
  auVar68._10_6_ = auVar134._10_6_;
  auVar68._8_2_ = uVar103;
  auVar68._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar30._4_8_ = auVar68._8_8_;
  auVar30._2_2_ = uVar103;
  auVar30._0_2_ = uVar103;
  fVar311 = (float)((int)sVar66 >> 8);
  fVar318 = (float)(auVar30._0_4_ >> 0x18);
  fVar320 = (float)(auVar68._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar58;
  auVar109._12_2_ = uVar103;
  auVar109._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar58;
  auVar108._10_2_ = uVar103;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar103;
  auVar107._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar31._4_8_ = auVar107._8_8_;
  auVar31._2_2_ = uVar103;
  auVar31._0_2_ = uVar103;
  fVar158 = (float)((int)sVar66 >> 8);
  fVar171 = (float)(auVar31._0_4_ >> 0x18);
  fVar172 = (float)(auVar107._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar58;
  auVar112._12_2_ = uVar103;
  auVar112._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar58;
  auVar111._10_2_ = uVar103;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar103;
  auVar110._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar32._4_8_ = auVar110._8_8_;
  auVar32._2_2_ = uVar103;
  auVar32._0_2_ = uVar103;
  fVar209 = (float)((int)sVar66 >> 8);
  fVar212 = (float)(auVar32._0_4_ >> 0x18);
  fVar213 = (float)(auVar110._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 0xf + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar58;
  auVar115._12_2_ = uVar103;
  auVar115._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar58;
  auVar114._10_2_ = uVar103;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar103;
  auVar113._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar33._4_8_ = auVar113._8_8_;
  auVar33._2_2_ = uVar103;
  auVar33._0_2_ = uVar103;
  fVar67 = (float)((int)sVar66 >> 8);
  fVar104 = (float)(auVar33._0_4_ >> 0x18);
  fVar105 = (float)(auVar113._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar58;
  auVar181._12_2_ = uVar103;
  auVar181._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar58;
  auVar180._10_2_ = uVar103;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar103;
  auVar179._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar34._4_8_ = auVar179._8_8_;
  auVar34._2_2_ = uVar103;
  auVar34._0_2_ = uVar103;
  fVar214 = (float)((int)sVar66 >> 8);
  fVar228 = (float)(auVar34._0_4_ >> 0x18);
  fVar230 = (float)(auVar179._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar52 + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar58;
  auVar184._12_2_ = uVar103;
  auVar184._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar58;
  auVar183._10_2_ = uVar103;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar103;
  auVar182._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar35._4_8_ = auVar182._8_8_;
  auVar35._2_2_ = uVar103;
  auVar35._0_2_ = uVar103;
  fVar243 = (float)((int)sVar66 >> 8);
  fVar256 = (float)(auVar35._0_4_ >> 0x18);
  fVar258 = (float)(auVar182._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 0x1a + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar58;
  auVar187._12_2_ = uVar103;
  auVar187._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar58;
  auVar186._10_2_ = uVar103;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar103;
  auVar185._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar36._4_8_ = auVar185._8_8_;
  auVar36._2_2_ = uVar103;
  auVar36._0_2_ = uVar103;
  fVar233 = (float)((int)sVar66 >> 8);
  fVar241 = (float)(auVar36._0_4_ >> 0x18);
  fVar242 = (float)(auVar185._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 0x1b + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar58;
  auVar190._12_2_ = uVar103;
  auVar190._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar58;
  auVar189._10_2_ = uVar103;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar103;
  auVar188._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar37._4_8_ = auVar188._8_8_;
  auVar37._2_2_ = uVar103;
  auVar37._0_2_ = uVar103;
  fVar261 = (float)((int)sVar66 >> 8);
  fVar273 = (float)(auVar37._0_4_ >> 0x18);
  fVar276 = (float)(auVar188._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar52 * 0x1c + 6);
  uVar102 = (undefined1)((uint)uVar13 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar13 >> 0x10);
  uVar28 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar13));
  uVar102 = (undefined1)((uint)uVar13 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar28 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar13,(char)uVar13);
  uVar58 = CONCAT62(uVar29,sVar66);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar58;
  auVar193._12_2_ = uVar103;
  auVar193._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar28 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar58;
  auVar192._10_2_ = uVar103;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar103;
  auVar191._0_8_ = uVar58;
  uVar103 = (undefined2)uVar29;
  auVar38._4_8_ = auVar191._8_8_;
  auVar38._2_2_ = uVar103;
  auVar38._0_2_ = uVar103;
  fVar106 = (float)((int)sVar66 >> 8);
  fVar130 = (float)(auVar38._0_4_ >> 0x18);
  fVar131 = (float)(auVar191._8_4_ >> 0x18);
  fVar298 = fVar132 * fVar311 + fVar143 * fVar158 + fVar145 * fVar209;
  fVar308 = fVar132 * fVar318 + fVar143 * fVar171 + fVar145 * fVar212;
  fVar309 = fVar132 * fVar320 + fVar143 * fVar172 + fVar145 * fVar213;
  fVar310 = fVar132 * (float)(auVar134._12_4_ >> 0x18) +
            fVar143 * (float)(auVar108._12_4_ >> 0x18) + fVar145 * (float)(auVar111._12_4_ >> 0x18);
  fVar281 = fVar132 * fVar67 + fVar143 * fVar214 + fVar145 * fVar243;
  fVar292 = fVar132 * fVar104 + fVar143 * fVar228 + fVar145 * fVar256;
  fVar294 = fVar132 * fVar105 + fVar143 * fVar230 + fVar145 * fVar258;
  fVar296 = fVar132 * (float)(auVar114._12_4_ >> 0x18) +
            fVar143 * (float)(auVar180._12_4_ >> 0x18) + fVar145 * (float)(auVar183._12_4_ >> 0x18);
  fVar177 = fVar132 * fVar233 + fVar143 * fVar261 + fVar145 * fVar106;
  fVar204 = fVar132 * fVar241 + fVar143 * fVar273 + fVar145 * fVar130;
  fVar206 = fVar132 * fVar242 + fVar143 * fVar276 + fVar145 * fVar131;
  fVar132 = fVar132 * (float)(auVar186._12_4_ >> 0x18) +
            fVar143 * (float)(auVar189._12_4_ >> 0x18) + fVar145 * (float)(auVar192._12_4_ >> 0x18);
  fVar312 = fVar311 * fVar148 + fVar158 * fVar156 + fVar209 * fVar157;
  fVar318 = fVar318 * fVar148 + fVar171 * fVar156 + fVar212 * fVar157;
  fVar320 = fVar320 * fVar148 + fVar172 * fVar156 + fVar213 * fVar157;
  fVar322 = (float)(auVar134._12_4_ >> 0x18) * fVar148 +
            (float)(auVar108._12_4_ >> 0x18) * fVar156 + (float)(auVar111._12_4_ >> 0x18) * fVar157;
  fVar243 = fVar67 * fVar148 + fVar214 * fVar156 + fVar243 * fVar157;
  fVar256 = fVar104 * fVar148 + fVar228 * fVar156 + fVar256 * fVar157;
  fVar258 = fVar105 * fVar148 + fVar230 * fVar156 + fVar258 * fVar157;
  fVar311 = (float)(auVar114._12_4_ >> 0x18) * fVar148 +
            (float)(auVar180._12_4_ >> 0x18) * fVar156 + (float)(auVar183._12_4_ >> 0x18) * fVar157;
  fVar233 = fVar148 * fVar233 + fVar156 * fVar261 + fVar157 * fVar106;
  fVar241 = fVar148 * fVar241 + fVar156 * fVar273 + fVar157 * fVar130;
  fVar242 = fVar148 * fVar242 + fVar156 * fVar276 + fVar157 * fVar131;
  fVar261 = fVar148 * (float)(auVar186._12_4_ >> 0x18) +
            fVar156 * (float)(auVar189._12_4_ >> 0x18) + fVar157 * (float)(auVar192._12_4_ >> 0x18);
  fVar145 = (float)DAT_01f80d30;
  fVar67 = DAT_01f80d30._4_4_;
  fVar104 = DAT_01f80d30._8_4_;
  fVar105 = DAT_01f80d30._12_4_;
  uVar60 = -(uint)(fVar145 <= ABS(fVar298));
  uVar62 = -(uint)(fVar67 <= ABS(fVar308));
  uVar64 = -(uint)(fVar104 <= ABS(fVar309));
  uVar65 = -(uint)(fVar105 <= ABS(fVar310));
  auVar299._0_4_ = (uint)fVar298 & uVar60;
  auVar299._4_4_ = (uint)fVar308 & uVar62;
  auVar299._8_4_ = (uint)fVar309 & uVar64;
  auVar299._12_4_ = (uint)fVar310 & uVar65;
  auVar149._0_4_ = ~uVar60 & (uint)fVar145;
  auVar149._4_4_ = ~uVar62 & (uint)fVar67;
  auVar149._8_4_ = ~uVar64 & (uint)fVar104;
  auVar149._12_4_ = ~uVar65 & (uint)fVar105;
  auVar149 = auVar149 | auVar299;
  uVar60 = -(uint)(fVar145 <= ABS(fVar281));
  uVar62 = -(uint)(fVar67 <= ABS(fVar292));
  uVar64 = -(uint)(fVar104 <= ABS(fVar294));
  uVar65 = -(uint)(fVar105 <= ABS(fVar296));
  auVar283._0_4_ = (uint)fVar281 & uVar60;
  auVar283._4_4_ = (uint)fVar292 & uVar62;
  auVar283._8_4_ = (uint)fVar294 & uVar64;
  auVar283._12_4_ = (uint)fVar296 & uVar65;
  auVar210._0_4_ = ~uVar60 & (uint)fVar145;
  auVar210._4_4_ = ~uVar62 & (uint)fVar67;
  auVar210._8_4_ = ~uVar64 & (uint)fVar104;
  auVar210._12_4_ = ~uVar65 & (uint)fVar105;
  auVar210 = auVar210 | auVar283;
  uVar60 = -(uint)(fVar145 <= ABS(fVar177));
  uVar62 = -(uint)(fVar67 <= ABS(fVar204));
  uVar64 = -(uint)(fVar104 <= ABS(fVar206));
  uVar65 = -(uint)(fVar105 <= ABS(fVar132));
  auVar194._0_4_ = (uint)fVar177 & uVar60;
  auVar194._4_4_ = (uint)fVar204 & uVar62;
  auVar194._8_4_ = (uint)fVar206 & uVar64;
  auVar194._12_4_ = (uint)fVar132 & uVar65;
  auVar216._0_4_ = ~uVar60 & (uint)fVar145;
  auVar216._4_4_ = ~uVar62 & (uint)fVar67;
  auVar216._8_4_ = ~uVar64 & (uint)fVar104;
  auVar216._12_4_ = ~uVar65 & (uint)fVar105;
  auVar216 = auVar216 | auVar194;
  auVar68 = rcpps(_DAT_01f80d30,auVar149);
  fVar145 = auVar68._0_4_;
  fVar105 = auVar68._4_4_;
  fVar158 = auVar68._8_4_;
  fVar214 = auVar68._12_4_;
  fVar145 = (1.0 - auVar149._0_4_ * fVar145) * fVar145 + fVar145;
  fVar105 = (1.0 - auVar149._4_4_ * fVar105) * fVar105 + fVar105;
  fVar158 = (1.0 - auVar149._8_4_ * fVar158) * fVar158 + fVar158;
  fVar214 = (1.0 - auVar149._12_4_ * fVar214) * fVar214 + fVar214;
  auVar68 = rcpps(auVar68,auVar210);
  fVar67 = auVar68._0_4_;
  fVar106 = auVar68._4_4_;
  fVar171 = auVar68._8_4_;
  fVar228 = auVar68._12_4_;
  fVar67 = (1.0 - auVar210._0_4_ * fVar67) * fVar67 + fVar67;
  fVar106 = (1.0 - auVar210._4_4_ * fVar106) * fVar106 + fVar106;
  fVar171 = (1.0 - auVar210._8_4_ * fVar171) * fVar171 + fVar171;
  fVar228 = (1.0 - auVar210._12_4_ * fVar228) * fVar228 + fVar228;
  auVar68 = rcpps(auVar68,auVar216);
  fVar104 = auVar68._0_4_;
  fVar130 = auVar68._4_4_;
  fVar172 = auVar68._8_4_;
  fVar230 = auVar68._12_4_;
  fVar104 = (1.0 - auVar216._0_4_ * fVar104) * fVar104 + fVar104;
  fVar130 = (1.0 - auVar216._4_4_ * fVar130) * fVar130 + fVar130;
  fVar172 = (1.0 - auVar216._8_4_ * fVar172) * fVar172 + fVar172;
  fVar230 = (1.0 - auVar216._12_4_ * fVar230) * fVar230 + fVar230;
  fVar273 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar19 + 0x16)) *
            *(float *)(prim + lVar19 + 0x1a);
  uVar58 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar103 = (undefined2)(uVar58 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar58;
  auVar69._12_2_ = uVar103;
  auVar69._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar58 >> 0x20);
  auVar250._12_4_ = auVar69._12_4_;
  auVar250._8_2_ = 0;
  auVar250._0_8_ = uVar58;
  auVar250._10_2_ = uVar103;
  auVar136._10_6_ = auVar250._10_6_;
  auVar136._8_2_ = uVar103;
  auVar136._0_8_ = uVar58;
  uVar103 = (undefined2)(uVar58 >> 0x10);
  auVar39._4_8_ = auVar136._8_8_;
  auVar39._2_2_ = uVar103;
  auVar39._0_2_ = uVar103;
  fVar131 = (float)(auVar39._0_4_ >> 0x10);
  fVar177 = (float)(auVar136._8_4_ >> 0x10);
  uVar53 = *(ulong *)(prim + uVar52 * 0xb + 6);
  uVar103 = (undefined2)(uVar53 >> 0x30);
  auVar152._8_4_ = 0;
  auVar152._0_8_ = uVar53;
  auVar152._12_2_ = uVar103;
  auVar152._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar53 >> 0x20);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar53;
  auVar151._10_2_ = uVar103;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = uVar103;
  auVar150._0_8_ = uVar53;
  uVar103 = (undefined2)(uVar53 >> 0x10);
  auVar40._4_8_ = auVar150._8_8_;
  auVar40._2_2_ = uVar103;
  auVar40._0_2_ = uVar103;
  uVar56 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar103 = (undefined2)(uVar56 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar56;
  auVar72._12_2_ = uVar103;
  auVar72._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar56 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar56;
  auVar71._10_2_ = uVar103;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar103;
  auVar70._0_8_ = uVar56;
  uVar103 = (undefined2)(uVar56 >> 0x10);
  auVar41._4_8_ = auVar70._8_8_;
  auVar41._2_2_ = uVar103;
  auVar41._0_2_ = uVar103;
  fVar132 = (float)(auVar41._0_4_ >> 0x10);
  fVar204 = (float)(auVar70._8_4_ >> 0x10);
  uVar5 = *(ulong *)(prim + uVar52 * 0xd + 6);
  uVar103 = (undefined2)(uVar5 >> 0x30);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar5;
  auVar219._12_2_ = uVar103;
  auVar219._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar5 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar5;
  auVar218._10_2_ = uVar103;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar103;
  auVar217._0_8_ = uVar5;
  uVar103 = (undefined2)(uVar5 >> 0x10);
  auVar42._4_8_ = auVar217._8_8_;
  auVar42._2_2_ = uVar103;
  auVar42._0_2_ = uVar103;
  uVar6 = *(ulong *)(prim + uVar52 * 0x12 + 6);
  uVar103 = (undefined2)(uVar6 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar6;
  auVar75._12_2_ = uVar103;
  auVar75._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar6 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar6;
  auVar74._10_2_ = uVar103;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar103;
  auVar73._0_8_ = uVar6;
  uVar103 = (undefined2)(uVar6 >> 0x10);
  auVar43._4_8_ = auVar73._8_8_;
  auVar43._2_2_ = uVar103;
  auVar43._0_2_ = uVar103;
  fVar143 = (float)(auVar43._0_4_ >> 0x10);
  fVar206 = (float)(auVar73._8_4_ >> 0x10);
  uVar57 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar7 = *(ulong *)(prim + uVar52 * 2 + uVar57 + 6);
  uVar103 = (undefined2)(uVar7 >> 0x30);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar7;
  auVar247._12_2_ = uVar103;
  auVar247._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar7 >> 0x20);
  auVar246._12_4_ = auVar247._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar7;
  auVar246._10_2_ = uVar103;
  auVar245._10_6_ = auVar246._10_6_;
  auVar245._8_2_ = uVar103;
  auVar245._0_8_ = uVar7;
  uVar103 = (undefined2)(uVar7 >> 0x10);
  auVar44._4_8_ = auVar245._8_8_;
  auVar44._2_2_ = uVar103;
  auVar44._0_2_ = uVar103;
  uVar57 = *(ulong *)(prim + uVar57 + 6);
  uVar103 = (undefined2)(uVar57 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar57;
  auVar78._12_2_ = uVar103;
  auVar78._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar57 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar57;
  auVar77._10_2_ = uVar103;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar103;
  auVar76._0_8_ = uVar57;
  uVar103 = (undefined2)(uVar57 >> 0x10);
  auVar45._4_8_ = auVar76._8_8_;
  auVar45._2_2_ = uVar103;
  auVar45._0_2_ = uVar103;
  fVar148 = (float)(auVar45._0_4_ >> 0x10);
  fVar209 = (float)(auVar76._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar52 * 0x18 + 6);
  uVar103 = (undefined2)(uVar8 >> 0x30);
  auVar266._8_4_ = 0;
  auVar266._0_8_ = uVar8;
  auVar266._12_2_ = uVar103;
  auVar266._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar8 >> 0x20);
  auVar265._12_4_ = auVar266._12_4_;
  auVar265._8_2_ = 0;
  auVar265._0_8_ = uVar8;
  auVar265._10_2_ = uVar103;
  auVar264._10_6_ = auVar265._10_6_;
  auVar264._8_2_ = uVar103;
  auVar264._0_8_ = uVar8;
  uVar103 = (undefined2)(uVar8 >> 0x10);
  auVar46._4_8_ = auVar264._8_8_;
  auVar46._2_2_ = uVar103;
  auVar46._0_2_ = uVar103;
  uVar9 = *(ulong *)(prim + uVar52 * 0x1d + 6);
  uVar103 = (undefined2)(uVar9 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar9;
  auVar81._12_2_ = uVar103;
  auVar81._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar9 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar9;
  auVar80._10_2_ = uVar103;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar103;
  auVar79._0_8_ = uVar9;
  uVar103 = (undefined2)(uVar9 >> 0x10);
  auVar47._4_8_ = auVar79._8_8_;
  auVar47._2_2_ = uVar103;
  auVar47._0_2_ = uVar103;
  fVar156 = (float)(auVar47._0_4_ >> 0x10);
  fVar212 = (float)(auVar79._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar52 + (ulong)(byte)PVar12 * 0x20 + 6);
  uVar103 = (undefined2)(uVar10 >> 0x30);
  auVar286._8_4_ = 0;
  auVar286._0_8_ = uVar10;
  auVar286._12_2_ = uVar103;
  auVar286._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar10 >> 0x20);
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._8_2_ = 0;
  auVar285._0_8_ = uVar10;
  auVar285._10_2_ = uVar103;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._8_2_ = uVar103;
  auVar284._0_8_ = uVar10;
  uVar103 = (undefined2)(uVar10 >> 0x10);
  auVar48._4_8_ = auVar284._8_8_;
  auVar48._2_2_ = uVar103;
  auVar48._0_2_ = uVar103;
  uVar11 = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar52) + 6);
  uVar103 = (undefined2)(uVar11 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar11;
  auVar84._12_2_ = uVar103;
  auVar84._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar11 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar11;
  auVar83._10_2_ = uVar103;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar103;
  auVar82._0_8_ = uVar11;
  uVar103 = (undefined2)(uVar11 >> 0x10);
  auVar49._4_8_ = auVar82._8_8_;
  auVar49._2_2_ = uVar103;
  auVar49._0_2_ = uVar103;
  fVar157 = (float)(auVar49._0_4_ >> 0x10);
  fVar213 = (float)(auVar82._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar52 * 0x23 + 6);
  uVar103 = (undefined2)(uVar52 >> 0x30);
  auVar302._8_4_ = 0;
  auVar302._0_8_ = uVar52;
  auVar302._12_2_ = uVar103;
  auVar302._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar52 >> 0x20);
  auVar301._12_4_ = auVar302._12_4_;
  auVar301._8_2_ = 0;
  auVar301._0_8_ = uVar52;
  auVar301._10_2_ = uVar103;
  auVar300._10_6_ = auVar301._10_6_;
  auVar300._8_2_ = uVar103;
  auVar300._0_8_ = uVar52;
  uVar103 = (undefined2)(uVar52 >> 0x10);
  auVar50._4_8_ = auVar300._8_8_;
  auVar50._2_2_ = uVar103;
  auVar50._0_2_ = uVar103;
  auVar153._0_8_ =
       CONCAT44(((((float)(auVar40._0_4_ >> 0x10) - fVar131) * fVar273 + fVar131) - fVar318) *
                fVar105,((((float)(int)(short)uVar53 - (float)(int)(short)uVar58) * fVar273 +
                         (float)(int)(short)uVar58) - fVar312) * fVar145);
  auVar153._8_4_ =
       ((((float)(auVar150._8_4_ >> 0x10) - fVar177) * fVar273 + fVar177) - fVar320) * fVar158;
  auVar153._12_4_ =
       ((((float)(auVar151._12_4_ >> 0x10) - (float)(auVar250._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar250._12_4_ >> 0x10)) - fVar322) * fVar214;
  auVar220._0_4_ =
       ((((float)(int)(short)uVar5 - (float)(int)(short)uVar56) * fVar273 +
        (float)(int)(short)uVar56) - fVar312) * fVar145;
  auVar220._4_4_ =
       ((((float)(auVar42._0_4_ >> 0x10) - fVar132) * fVar273 + fVar132) - fVar318) * fVar105;
  auVar220._8_4_ =
       ((((float)(auVar217._8_4_ >> 0x10) - fVar204) * fVar273 + fVar204) - fVar320) * fVar158;
  auVar220._12_4_ =
       ((((float)(auVar218._12_4_ >> 0x10) - (float)(auVar71._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar71._12_4_ >> 0x10)) - fVar322) * fVar214;
  auVar248._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar143) * fVar273 + fVar143) - fVar256) *
                fVar106,((((float)(int)(short)uVar7 - (float)(int)(short)uVar6) * fVar273 +
                         (float)(int)(short)uVar6) - fVar243) * fVar67);
  auVar248._8_4_ =
       ((((float)(auVar245._8_4_ >> 0x10) - fVar206) * fVar273 + fVar206) - fVar258) * fVar171;
  auVar248._12_4_ =
       ((((float)(auVar246._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar311) * fVar228;
  auVar267._0_4_ =
       ((((float)(int)(short)uVar8 - (float)(int)(short)uVar57) * fVar273 +
        (float)(int)(short)uVar57) - fVar243) * fVar67;
  auVar267._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar148) * fVar273 + fVar148) - fVar256) * fVar106;
  auVar267._8_4_ =
       ((((float)(auVar264._8_4_ >> 0x10) - fVar209) * fVar273 + fVar209) - fVar258) * fVar171;
  auVar267._12_4_ =
       ((((float)(auVar265._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar311) * fVar228;
  auVar287._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar156) * fVar273 + fVar156) - fVar241) *
                fVar130,((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar273 +
                         (float)(int)(short)uVar9) - fVar233) * fVar104);
  auVar287._8_4_ =
       ((((float)(auVar284._8_4_ >> 0x10) - fVar212) * fVar273 + fVar212) - fVar242) * fVar172;
  auVar287._12_4_ =
       ((((float)(auVar285._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar261) * fVar230;
  auVar303._0_4_ =
       ((((float)(int)(short)uVar52 - (float)(int)(short)uVar11) * fVar273 +
        (float)(int)(short)uVar11) - fVar233) * fVar104;
  auVar303._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar157) * fVar273 + fVar157) - fVar241) * fVar130;
  auVar303._8_4_ =
       ((((float)(auVar300._8_4_ >> 0x10) - fVar213) * fVar273 + fVar213) - fVar242) * fVar172;
  auVar303._12_4_ =
       ((((float)(auVar301._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar273 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar261) * fVar230;
  auVar133._8_4_ = auVar153._8_4_;
  auVar133._0_8_ = auVar153._0_8_;
  auVar133._12_4_ = auVar153._12_4_;
  auVar134 = minps(auVar133,auVar220);
  auVar85._8_4_ = auVar248._8_4_;
  auVar85._0_8_ = auVar248._0_8_;
  auVar85._12_4_ = auVar248._12_4_;
  auVar68 = minps(auVar85,auVar267);
  auVar134 = maxps(auVar134,auVar68);
  auVar86._8_4_ = auVar287._8_4_;
  auVar86._0_8_ = auVar287._0_8_;
  auVar86._12_4_ = auVar287._12_4_;
  auVar68 = minps(auVar86,auVar303);
  uVar13 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar116._4_4_ = uVar13;
  auVar116._0_4_ = uVar13;
  auVar116._8_4_ = uVar13;
  auVar116._12_4_ = uVar13;
  auVar68 = maxps(auVar68,auVar116);
  auVar68 = maxps(auVar134,auVar68);
  local_168 = auVar68._0_4_ * 0.99999964;
  fStack_164 = auVar68._4_4_ * 0.99999964;
  fStack_160 = auVar68._8_4_ * 0.99999964;
  fStack_15c = auVar68._12_4_ * 0.99999964;
  auVar68 = maxps(auVar153,auVar220);
  auVar134 = maxps(auVar248,auVar267);
  auVar68 = minps(auVar68,auVar134);
  auVar134 = maxps(auVar287,auVar303);
  fVar145 = ray->tfar;
  auVar87._4_4_ = fVar145;
  auVar87._0_4_ = fVar145;
  auVar87._8_4_ = fVar145;
  auVar87._12_4_ = fVar145;
  auVar134 = minps(auVar134,auVar87);
  auVar68 = minps(auVar68,auVar134);
  uVar60 = (uint)(byte)PVar12;
  auVar117._0_4_ = -(uint)(uVar60 != 0 && local_168 <= auVar68._0_4_ * 1.0000004);
  auVar117._4_4_ = -(uint)(1 < uVar60 && fStack_164 <= auVar68._4_4_ * 1.0000004);
  auVar117._8_4_ = -(uint)(2 < uVar60 && fStack_160 <= auVar68._8_4_ * 1.0000004);
  auVar117._12_4_ = -(uint)(3 < uVar60 && fStack_15c <= auVar68._12_4_ * 1.0000004);
  uVar60 = movmskps(uVar60,auVar117);
  if (uVar60 == 0) {
    uVar58 = 0;
LAB_00b536a4:
    return (bool)((byte)uVar58 & 1);
  }
  uVar60 = uVar60 & 0xff;
  local_158._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_158._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_158._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_158._12_4_ = 0;
  local_270 = prim;
LAB_00b51194:
  lVar19 = 0;
  if (uVar60 != 0) {
    for (; (uVar60 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
    }
  }
  local_330 = (ulong)*(uint *)(local_270 + 2);
  uVar62 = *(uint *)(local_270 + lVar19 * 4 + 6);
  pGVar14 = (context->scene->geometries).items[local_330].ptr;
  fVar145 = pGVar14->fnumTimeSegments;
  fVar67 = (pGVar14->time_range).lower;
  fVar104 = (((ray->dir).field_0.m128[3] - fVar67) / ((pGVar14->time_range).upper - fVar67)) *
            fVar145;
  fVar67 = floorf(fVar104);
  fVar145 = fVar145 + -1.0;
  if (fVar145 <= fVar67) {
    fVar67 = fVar145;
  }
  fVar145 = 0.0;
  if (0.0 <= fVar67) {
    fVar145 = fVar67;
  }
  fVar104 = fVar104 - fVar145;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                           (ulong)uVar62 *
                           pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar55 = (long)(int)fVar145 * 0x38;
  lVar16 = *(long *)(_Var15 + lVar55);
  lVar17 = *(long *)(_Var15 + 0x10 + lVar55);
  pfVar3 = (float *)(lVar16 + lVar17 * uVar53);
  fVar145 = *pfVar3;
  fVar67 = pfVar3[1];
  fVar105 = pfVar3[2];
  fVar106 = pfVar3[3];
  lVar19 = uVar53 + 1;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar19);
  fVar130 = *pfVar3;
  fVar131 = pfVar3[1];
  fVar132 = pfVar3[2];
  fVar143 = pfVar3[3];
  lVar1 = uVar53 + 2;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar1);
  fVar148 = *pfVar3;
  fVar156 = pfVar3[1];
  fVar157 = pfVar3[2];
  fVar158 = pfVar3[3];
  lVar2 = uVar53 + 3;
  pfVar3 = (float *)(lVar16 + lVar17 * lVar2);
  fVar171 = *pfVar3;
  fVar172 = pfVar3[1];
  fVar177 = pfVar3[2];
  fVar204 = pfVar3[3];
  lVar16 = *(long *)&pGVar14[4].fnumTimeSegments;
  lVar17 = *(long *)(lVar16 + lVar55);
  lVar18 = *(long *)(lVar16 + 0x10 + lVar55);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar53);
  fVar206 = *pfVar3;
  fVar209 = pfVar3[1];
  fVar212 = pfVar3[2];
  fVar213 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar19);
  fVar214 = *pfVar3;
  fVar228 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar243 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar256 = *pfVar3;
  fVar258 = pfVar3[1];
  fVar311 = pfVar3[2];
  fVar233 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar241 = *pfVar3;
  fVar242 = pfVar3[1];
  fVar261 = pfVar3[2];
  fVar273 = pfVar3[3];
  fVar322 = (fVar148 * 0.5 + fVar171 * 0.0 + fVar130 * 0.0) - fVar145 * 0.5;
  fVar144 = (fVar156 * 0.5 + fVar172 * 0.0 + fVar131 * 0.0) - fVar67 * 0.5;
  fVar146 = (fVar157 * 0.5 + fVar177 * 0.0 + fVar132 * 0.0) - fVar105 * 0.5;
  fVar147 = (fVar158 * 0.5 + fVar204 * 0.0 + fVar143 * 0.0) - fVar106 * 0.5;
  fVar282 = (fVar256 * 0.5 + fVar241 * 0.0 + fVar214 * 0.0) - fVar206 * 0.5;
  fVar293 = (fVar258 * 0.5 + fVar242 * 0.0 + fVar228 * 0.0) - fVar209 * 0.5;
  fVar295 = (fVar311 * 0.5 + fVar261 * 0.0 + fVar230 * 0.0) - fVar212 * 0.5;
  fVar297 = (fVar233 * 0.5 + fVar273 * 0.0 + fVar243 * 0.0) - fVar213 * 0.5;
  fVar281 = fVar148 * 0.0 + fVar171 * -0.0 + fVar130 + fVar145 * -0.0;
  fVar294 = fVar156 * 0.0 + fVar172 * -0.0 + fVar131 + fVar67 * -0.0;
  fVar298 = fVar157 * 0.0 + fVar177 * -0.0 + fVar132 + fVar105 * -0.0;
  fVar309 = fVar158 * 0.0 + fVar204 * -0.0 + fVar143 + fVar106 * -0.0;
  fVar313 = fVar256 * 0.0 + fVar241 * -0.0 + fVar214 + fVar206 * -0.0;
  fVar319 = fVar258 * 0.0 + fVar242 * -0.0 + fVar228 + fVar209 * -0.0;
  fVar321 = fVar311 * 0.0 + fVar261 * -0.0 + fVar230 + fVar212 * -0.0;
  fVar323 = fVar233 * 0.0 + fVar273 * -0.0 + fVar243 + fVar213 * -0.0;
  fVar276 = fVar171 * -0.0 + fVar148 + fVar130 * 0.0 + fVar145 * -0.0;
  fVar292 = fVar172 * -0.0 + fVar156 + fVar131 * 0.0 + fVar67 * -0.0;
  fVar296 = fVar177 * -0.0 + fVar157 + fVar132 * 0.0 + fVar105 * -0.0;
  fVar308 = fVar204 * -0.0 + fVar158 + fVar143 * 0.0 + fVar106 * -0.0;
  fVar310 = fVar145 * 0.0 + ((fVar171 * 0.5 + fVar148 * 0.0) - fVar130 * 0.5);
  fVar312 = fVar67 * 0.0 + ((fVar172 * 0.5 + fVar156 * 0.0) - fVar131 * 0.5);
  fVar318 = fVar105 * 0.0 + ((fVar177 * 0.5 + fVar157 * 0.0) - fVar132 * 0.5);
  fVar320 = fVar106 * 0.0 + ((fVar204 * 0.5 + fVar158 * 0.0) - fVar143 * 0.5);
  fVar130 = fVar241 * -0.0 + fVar256 + fVar214 * 0.0 + fVar206 * -0.0;
  fVar131 = fVar242 * -0.0 + fVar258 + fVar228 * 0.0 + fVar209 * -0.0;
  fVar132 = fVar261 * -0.0 + fVar311 + fVar230 * 0.0 + fVar212 * -0.0;
  fVar148 = fVar273 * -0.0 + fVar233 + fVar243 * 0.0 + fVar213 * -0.0;
  fVar145 = fVar206 * 0.0 + ((fVar241 * 0.5 + fVar256 * 0.0) - fVar214 * 0.5);
  fVar67 = fVar209 * 0.0 + ((fVar242 * 0.5 + fVar258 * 0.0) - fVar228 * 0.5);
  fVar105 = fVar212 * 0.0 + ((fVar261 * 0.5 + fVar311 * 0.0) - fVar230 * 0.5);
  fVar106 = fVar213 * 0.0 + ((fVar273 * 0.5 + fVar233 * 0.0) - fVar243 * 0.5);
  fVar214 = fVar144 * fVar313 - fVar319 * fVar322;
  fVar228 = fVar146 * fVar319 - fVar321 * fVar144;
  fVar230 = fVar322 * fVar321 - fVar313 * fVar146;
  fVar243 = fVar147 * fVar323 - fVar323 * fVar147;
  fVar171 = fVar144 * fVar282 - fVar293 * fVar322;
  fVar177 = fVar146 * fVar293 - fVar295 * fVar144;
  fVar204 = fVar322 * fVar295 - fVar282 * fVar146;
  fVar143 = fVar312 * fVar130 - fVar131 * fVar310;
  fVar156 = fVar318 * fVar131 - fVar132 * fVar312;
  fVar157 = fVar310 * fVar132 - fVar130 * fVar318;
  fVar158 = fVar320 * fVar148 - fVar148 * fVar320;
  fVar130 = fVar312 * fVar145 - fVar67 * fVar310;
  fVar131 = fVar318 * fVar67 - fVar105 * fVar312;
  fVar105 = fVar310 * fVar105 - fVar145 * fVar318;
  fVar209 = fVar230 * fVar230 + fVar228 * fVar228 + fVar214 * fVar214;
  auVar134 = ZEXT416((uint)fVar209);
  auVar68 = rsqrtss(ZEXT416((uint)fVar209),auVar134);
  fVar145 = auVar68._0_4_;
  fVar212 = fVar145 * 1.5 - fVar145 * fVar145 * fVar209 * 0.5 * fVar145;
  fVar256 = fVar214 * fVar171 + fVar230 * fVar204 + fVar228 * fVar177;
  fVar145 = fVar243 * fVar212;
  auVar68 = rcpss(auVar134,auVar134);
  fVar172 = (2.0 - fVar209 * auVar68._0_4_) * auVar68._0_4_;
  fVar206 = fVar157 * fVar157 + fVar156 * fVar156 + fVar143 * fVar143;
  auVar68 = ZEXT416((uint)fVar206);
  auVar134 = rsqrtss(ZEXT416((uint)fVar206),auVar68);
  fVar67 = auVar134._0_4_;
  fVar148 = fVar67 * 1.5 - fVar67 * fVar67 * fVar206 * 0.5 * fVar67;
  fVar213 = fVar143 * fVar130 + fVar157 * fVar105 + fVar156 * fVar131;
  fVar132 = fVar158 * fVar148;
  auVar68 = rcpss(auVar68,auVar68);
  fVar67 = (2.0 - fVar206 * auVar68._0_4_) * auVar68._0_4_;
  fVar215 = fVar309 * fVar228 * fVar212;
  fVar229 = fVar309 * fVar230 * fVar212;
  fVar231 = fVar309 * fVar214 * fVar212;
  fVar232 = fVar309 * fVar145;
  fVar262 = fVar281 - fVar215;
  fVar274 = fVar294 - fVar229;
  fVar277 = fVar298 - fVar231;
  fVar279 = fVar309 - fVar232;
  fVar244 = fVar309 * fVar172 * (fVar209 * fVar177 - fVar256 * fVar228) * fVar212 +
            fVar147 * fVar228 * fVar212;
  fVar257 = fVar309 * fVar172 * (fVar209 * fVar204 - fVar256 * fVar230) * fVar212 +
            fVar147 * fVar230 * fVar212;
  fVar259 = fVar309 * fVar172 * (fVar209 * fVar171 - fVar256 * fVar214) * fVar212 +
            fVar147 * fVar214 * fVar212;
  fVar260 = fVar309 * fVar172 * (fVar209 * (fVar147 * fVar297 - fVar297 * fVar147) -
                                fVar256 * fVar243) * fVar212 + fVar147 * fVar145;
  fVar215 = fVar215 + fVar281;
  fVar229 = fVar229 + fVar294;
  fVar231 = fVar231 + fVar298;
  fVar232 = fVar232 + fVar309;
  fVar281 = fVar308 * fVar156 * fVar148;
  fVar294 = fVar308 * fVar157 * fVar148;
  fVar298 = fVar308 * fVar143 * fVar148;
  fVar309 = fVar308 * fVar132;
  fVar313 = fVar276 - fVar281;
  fVar321 = fVar292 - fVar294;
  fVar173 = fVar296 - fVar298;
  fVar175 = fVar308 - fVar309;
  fVar282 = fVar308 * fVar67 * (fVar206 * fVar131 - fVar213 * fVar156) * fVar148 +
            fVar320 * fVar156 * fVar148;
  fVar293 = fVar308 * fVar67 * (fVar206 * fVar105 - fVar213 * fVar157) * fVar148 +
            fVar320 * fVar157 * fVar148;
  fVar295 = fVar308 * fVar67 * (fVar206 * fVar130 - fVar213 * fVar143) * fVar148 +
            fVar320 * fVar143 * fVar148;
  fVar297 = fVar308 * fVar67 * (fVar206 * (fVar320 * fVar106 - fVar106 * fVar320) -
                               fVar213 * fVar158) * fVar148 + fVar320 * fVar132;
  fVar281 = fVar281 + fVar276;
  fVar294 = fVar294 + fVar292;
  fVar298 = fVar298 + fVar296;
  fVar309 = fVar309 + fVar308;
  lVar17 = *(long *)(_Var15 + 0x38 + lVar55);
  lVar18 = *(long *)(_Var15 + 0x48 + lVar55);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar53);
  fVar145 = *pfVar3;
  fVar67 = pfVar3[1];
  fVar105 = pfVar3[2];
  fVar106 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar19);
  fVar130 = *pfVar3;
  fVar131 = pfVar3[1];
  fVar132 = pfVar3[2];
  fVar143 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar148 = *pfVar3;
  fVar156 = pfVar3[1];
  fVar157 = pfVar3[2];
  fVar158 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar171 = *pfVar3;
  fVar172 = pfVar3[1];
  fVar177 = pfVar3[2];
  fVar204 = pfVar3[3];
  fVar319 = (fVar148 * 0.5 + fVar171 * 0.0 + fVar130 * 0.0) - fVar145 * 0.5;
  fVar323 = (fVar156 * 0.5 + fVar172 * 0.0 + fVar131 * 0.0) - fVar67 * 0.5;
  fVar174 = (fVar157 * 0.5 + fVar177 * 0.0 + fVar132 * 0.0) - fVar105 * 0.5;
  fVar176 = (fVar158 * 0.5 + fVar204 * 0.0 + fVar143 * 0.0) - fVar106 * 0.5;
  lVar17 = *(long *)(lVar16 + 0x38 + lVar55);
  lVar16 = *(long *)(lVar16 + 0x48 + lVar55);
  uVar53 = uVar53 * lVar16;
  pfVar3 = (float *)(lVar17 + lVar16 * lVar2);
  fVar206 = *pfVar3;
  fVar209 = pfVar3[1];
  fVar212 = pfVar3[2];
  fVar213 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar1 * lVar16);
  fVar214 = *pfVar3;
  fVar228 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar243 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + lVar19 * lVar16);
  fVar256 = *pfVar3;
  fVar258 = pfVar3[1];
  fVar311 = pfVar3[2];
  fVar233 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + uVar53);
  fVar241 = *pfVar3;
  fVar242 = pfVar3[1];
  fVar261 = pfVar3[2];
  fVar273 = pfVar3[3];
  fVar263 = (fVar214 * 0.5 + fVar206 * 0.0 + fVar256 * 0.0) - fVar241 * 0.5;
  fVar275 = (fVar228 * 0.5 + fVar209 * 0.0 + fVar258 * 0.0) - fVar242 * 0.5;
  fVar278 = (fVar230 * 0.5 + fVar212 * 0.0 + fVar311 * 0.0) - fVar261 * 0.5;
  fVar280 = (fVar243 * 0.5 + fVar213 * 0.0 + fVar233 * 0.0) - fVar273 * 0.5;
  fVar276 = fVar148 * 0.0 + fVar171 * -0.0 + fVar130 + fVar145 * -0.0;
  fVar292 = fVar156 * 0.0 + fVar172 * -0.0 + fVar131 + fVar67 * -0.0;
  fVar296 = fVar157 * 0.0 + fVar177 * -0.0 + fVar132 + fVar105 * -0.0;
  fVar308 = fVar158 * 0.0 + fVar204 * -0.0 + fVar143 + fVar106 * -0.0;
  fVar178 = fVar171 * -0.0 + fVar148 + fVar130 * 0.0 + fVar145 * -0.0;
  fVar205 = fVar172 * -0.0 + fVar156 + fVar131 * 0.0 + fVar67 * -0.0;
  fVar207 = fVar177 * -0.0 + fVar157 + fVar132 * 0.0 + fVar105 * -0.0;
  fVar208 = fVar204 * -0.0 + fVar158 + fVar143 * 0.0 + fVar106 * -0.0;
  fVar148 = fVar145 * 0.0 + ((fVar171 * 0.5 + fVar148 * 0.0) - fVar130 * 0.5);
  fVar171 = fVar67 * 0.0 + ((fVar172 * 0.5 + fVar156 * 0.0) - fVar131 * 0.5);
  fVar172 = fVar105 * 0.0 + ((fVar177 * 0.5 + fVar157 * 0.0) - fVar132 * 0.5);
  fVar177 = fVar106 * 0.0 + ((fVar204 * 0.5 + fVar158 * 0.0) - fVar143 * 0.5);
  fVar130 = fVar214 * 0.0 + fVar206 * -0.0 + fVar256 + fVar241 * -0.0;
  fVar143 = fVar228 * 0.0 + fVar209 * -0.0 + fVar258 + fVar242 * -0.0;
  fVar156 = fVar230 * 0.0 + fVar212 * -0.0 + fVar311 + fVar261 * -0.0;
  fVar157 = fVar243 * 0.0 + fVar213 * -0.0 + fVar233 + fVar273 * -0.0;
  fVar145 = fVar206 * -0.0 + fVar214 + fVar256 * 0.0 + fVar241 * -0.0;
  fVar67 = fVar209 * -0.0 + fVar228 + fVar258 * 0.0 + fVar242 * -0.0;
  fVar105 = fVar212 * -0.0 + fVar230 + fVar311 * 0.0 + fVar261 * -0.0;
  fVar106 = fVar213 * -0.0 + fVar243 + fVar233 * 0.0 + fVar273 * -0.0;
  fVar132 = fVar241 * 0.0 + ((fVar206 * 0.5 + fVar214 * 0.0) - fVar256 * 0.5);
  fVar131 = fVar242 * 0.0 + ((fVar209 * 0.5 + fVar228 * 0.0) - fVar258 * 0.5);
  fVar204 = fVar261 * 0.0 + ((fVar212 * 0.5 + fVar230 * 0.0) - fVar311 * 0.5);
  fVar242 = fVar273 * 0.0 + ((fVar213 * 0.5 + fVar243 * 0.0) - fVar233 * 0.5);
  fVar243 = fVar323 * fVar130 - fVar143 * fVar319;
  fVar256 = fVar174 * fVar143 - fVar156 * fVar323;
  fVar258 = fVar319 * fVar156 - fVar130 * fVar174;
  fVar311 = fVar176 * fVar157 - fVar157 * fVar176;
  fVar158 = fVar323 * fVar263 - fVar275 * fVar319;
  fVar156 = fVar174 * fVar275 - fVar278 * fVar323;
  fVar157 = fVar319 * fVar278 - fVar263 * fVar174;
  fVar143 = fVar171 * fVar145 - fVar67 * fVar148;
  fVar209 = fVar172 * fVar67 - fVar105 * fVar171;
  fVar213 = fVar148 * fVar105 - fVar145 * fVar172;
  fVar228 = fVar177 * fVar106 - fVar106 * fVar177;
  fVar130 = fVar171 * fVar132 - fVar131 * fVar148;
  fVar131 = fVar172 * fVar131 - fVar204 * fVar171;
  fVar132 = fVar148 * fVar204 - fVar132 * fVar172;
  fVar106 = fVar258 * fVar258 + fVar256 * fVar256 + fVar243 * fVar243;
  auVar134 = ZEXT416((uint)fVar106);
  auVar68 = rsqrtss(ZEXT416((uint)fVar106),auVar134);
  fVar145 = auVar68._0_4_;
  fVar204 = fVar145 * 1.5 - fVar145 * fVar145 * fVar106 * 0.5 * fVar145;
  fVar145 = fVar243 * fVar158 + fVar258 * fVar157 + fVar256 * fVar156;
  auVar68 = rcpss(auVar134,auVar134);
  fVar67 = (2.0 - fVar106 * auVar68._0_4_) * auVar68._0_4_;
  fVar105 = fVar311 * fVar204;
  fVar261 = fVar213 * fVar213 + fVar209 * fVar209 + fVar143 * fVar143;
  auVar68 = ZEXT416((uint)fVar261);
  auVar134 = rsqrtss(ZEXT416((uint)fVar261),auVar68);
  fVar206 = auVar134._0_4_;
  fVar263 = fVar206 * 1.5 - fVar206 * fVar206 * fVar261 * 0.5 * fVar206;
  fVar275 = fVar143 * fVar130 + fVar213 * fVar132 + fVar209 * fVar131;
  auVar68 = rcpss(auVar68,auVar68);
  fVar278 = (2.0 - fVar261 * auVar68._0_4_) * auVar68._0_4_;
  fVar273 = fVar228 * fVar263;
  fVar206 = fVar308 * fVar256 * fVar204;
  fVar212 = fVar308 * fVar258 * fVar204;
  fVar214 = fVar308 * fVar243 * fVar204;
  fVar230 = fVar308 * fVar105;
  fVar156 = fVar308 * fVar67 * (fVar106 * fVar156 - fVar145 * fVar256) * fVar204 +
            fVar176 * fVar256 * fVar204;
  fVar157 = fVar308 * fVar67 * (fVar106 * fVar157 - fVar145 * fVar258) * fVar204 +
            fVar176 * fVar258 * fVar204;
  fVar158 = fVar308 * fVar67 * (fVar106 * fVar158 - fVar145 * fVar243) * fVar204 +
            fVar176 * fVar243 * fVar204;
  fVar204 = fVar308 * fVar67 * (fVar106 * (fVar176 * fVar280 - fVar280 * fVar176) -
                               fVar145 * fVar311) * fVar204 + fVar176 * fVar105;
  fVar243 = fVar276 - fVar206;
  fVar256 = fVar292 - fVar212;
  fVar258 = fVar296 - fVar214;
  fVar311 = fVar308 - fVar230;
  fVar206 = fVar206 + fVar276;
  fVar212 = fVar212 + fVar292;
  fVar214 = fVar214 + fVar296;
  fVar230 = fVar230 + fVar308;
  fVar145 = fVar208 * fVar209 * fVar263;
  fVar67 = fVar208 * fVar213 * fVar263;
  fVar105 = fVar208 * fVar143 * fVar263;
  fVar106 = fVar208 * fVar273;
  fVar209 = fVar208 * fVar278 * (fVar261 * fVar131 - fVar275 * fVar209) * fVar263 +
            fVar177 * fVar209 * fVar263;
  fVar233 = fVar208 * fVar278 * (fVar261 * fVar132 - fVar275 * fVar213) * fVar263 +
            fVar177 * fVar213 * fVar263;
  fVar241 = fVar208 * fVar278 * (fVar261 * fVar130 - fVar275 * fVar143) * fVar263 +
            fVar177 * fVar143 * fVar263;
  fVar228 = fVar208 * fVar278 * (fVar261 * (fVar177 * fVar242 - fVar242 * fVar177) -
                                fVar275 * fVar228) * fVar263 + fVar177 * fVar273;
  fVar130 = fVar178 - fVar145;
  fVar131 = fVar205 - fVar67;
  fVar132 = fVar207 - fVar105;
  fVar143 = fVar208 - fVar106;
  fVar145 = fVar145 + fVar178;
  fVar67 = fVar67 + fVar205;
  fVar105 = fVar105 + fVar207;
  fVar106 = fVar106 + fVar208;
  fVar213 = 1.0 - fVar104;
  local_368 = fVar262 * fVar213 + fVar243 * fVar104;
  fStack_364 = fVar274 * fVar213 + fVar256 * fVar104;
  fStack_360 = fVar277 * fVar213 + fVar258 * fVar104;
  fStack_35c = fVar279 * fVar213 + fVar311 * fVar104;
  local_378 = ((fVar322 - fVar244) * 0.33333334 + fVar262) * fVar213 +
              ((fVar319 - fVar156) * 0.33333334 + fVar243) * fVar104;
  fStack_374 = ((fVar144 - fVar257) * 0.33333334 + fVar274) * fVar213 +
               ((fVar323 - fVar157) * 0.33333334 + fVar256) * fVar104;
  fStack_370 = ((fVar146 - fVar259) * 0.33333334 + fVar277) * fVar213 +
               ((fVar174 - fVar158) * 0.33333334 + fVar258) * fVar104;
  fStack_36c = ((fVar147 - fVar260) * 0.33333334 + fVar279) * fVar213 +
               ((fVar176 - fVar204) * 0.33333334 + fVar311) * fVar104;
  local_398 = (fVar313 - (fVar310 - fVar282) * 0.33333334) * fVar213 +
              (fVar130 - (fVar148 - fVar209) * 0.33333334) * fVar104;
  fStack_394 = (fVar321 - (fVar312 - fVar293) * 0.33333334) * fVar213 +
               (fVar131 - (fVar171 - fVar233) * 0.33333334) * fVar104;
  fStack_390 = (fVar173 - (fVar318 - fVar295) * 0.33333334) * fVar213 +
               (fVar132 - (fVar172 - fVar241) * 0.33333334) * fVar104;
  fStack_38c = (fVar175 - (fVar320 - fVar297) * 0.33333334) * fVar213 +
               (fVar143 - (fVar177 - fVar228) * 0.33333334) * fVar104;
  local_388 = fVar313 * fVar213 + fVar130 * fVar104;
  fStack_384 = fVar321 * fVar213 + fVar131 * fVar104;
  fStack_380 = fVar173 * fVar213 + fVar132 * fVar104;
  fStack_37c = fVar175 * fVar213 + fVar143 * fVar104;
  local_358 = fVar215 * fVar213 + fVar206 * fVar104;
  fStack_354 = fVar229 * fVar213 + fVar212 * fVar104;
  fStack_350 = fVar231 * fVar213 + fVar214 * fVar104;
  fStack_34c = fVar232 * fVar213 + fVar230 * fVar104;
  local_348 = ((fVar244 + fVar322) * 0.33333334 + fVar215) * fVar213 +
              ((fVar156 + fVar319) * 0.33333334 + fVar206) * fVar104;
  fStack_344 = ((fVar257 + fVar144) * 0.33333334 + fVar229) * fVar213 +
               ((fVar157 + fVar323) * 0.33333334 + fVar212) * fVar104;
  fStack_340 = ((fVar259 + fVar146) * 0.33333334 + fVar231) * fVar213 +
               ((fVar158 + fVar174) * 0.33333334 + fVar214) * fVar104;
  fStack_33c = ((fVar260 + fVar147) * 0.33333334 + fVar232) * fVar213 +
               ((fVar204 + fVar176) * 0.33333334 + fVar230) * fVar104;
  local_3b8 = (fVar281 - (fVar282 + fVar310) * 0.33333334) * fVar213 +
              (fVar145 - (fVar209 + fVar148) * 0.33333334) * fVar104;
  fStack_3b4 = (fVar294 - (fVar293 + fVar312) * 0.33333334) * fVar213 +
               (fVar67 - (fVar233 + fVar171) * 0.33333334) * fVar104;
  fStack_3b0 = (fVar298 - (fVar295 + fVar318) * 0.33333334) * fVar213 +
               (fVar105 - (fVar241 + fVar172) * 0.33333334) * fVar104;
  fStack_3ac = (fVar309 - (fVar297 + fVar320) * 0.33333334) * fVar213 +
               (fVar106 - (fVar228 + fVar177) * 0.33333334) * fVar104;
  local_208 = fVar213 * fVar281 + fVar104 * fVar145;
  fStack_204 = fVar213 * fVar294 + fVar104 * fVar67;
  fStack_200 = fVar213 * fVar298 + fVar104 * fVar105;
  fStack_1fc = fVar213 * fVar309 + fVar104 * fVar106;
  fVar145 = (ray->org).field_0.m128[0];
  fVar67 = (ray->org).field_0.m128[1];
  fVar104 = (ray->org).field_0.m128[2];
  fVar105 = (pre->ray_space).vx.field_0.m128[0];
  fVar106 = (pre->ray_space).vx.field_0.m128[1];
  fVar130 = (pre->ray_space).vy.field_0.m128[0];
  fVar131 = (pre->ray_space).vy.field_0.m128[1];
  fVar132 = (pre->ray_space).vz.field_0.m128[0];
  fVar143 = (pre->ray_space).vz.field_0.m128[1];
  fVar171 = (local_368 - fVar145) * fVar105 +
            (fStack_364 - fVar67) * fVar130 + (fStack_360 - fVar104) * fVar132;
  fVar172 = (local_368 - fVar145) * fVar106 +
            (fStack_364 - fVar67) * fVar131 + (fStack_360 - fVar104) * fVar143;
  local_2a8 = CONCAT44(fVar172,fVar171);
  fVar148 = (local_378 - fVar145) * fVar105 +
            (fStack_374 - fVar67) * fVar130 + (fStack_370 - fVar104) * fVar132;
  fVar156 = (local_378 - fVar145) * fVar106 +
            (fStack_374 - fVar67) * fVar131 + (fStack_370 - fVar104) * fVar143;
  local_2b8 = CONCAT44(fVar156,fVar148);
  fVar206 = (local_398 - fVar145) * fVar105 +
            (fStack_394 - fVar67) * fVar130 + (fStack_390 - fVar104) * fVar132;
  fVar209 = (local_398 - fVar145) * fVar106 +
            (fStack_394 - fVar67) * fVar131 + (fStack_390 - fVar104) * fVar143;
  local_2c8 = CONCAT44(fVar209,fVar206);
  fVar157 = (local_388 - fVar145) * fVar105 +
            (fStack_384 - fVar67) * fVar130 + (fStack_380 - fVar104) * fVar132;
  fVar158 = (local_388 - fVar145) * fVar106 +
            (fStack_384 - fVar67) * fVar131 + (fStack_380 - fVar104) * fVar143;
  local_2d8 = CONCAT44(fVar158,fVar157);
  local_2e8 = (local_358 - fVar145) * fVar105 +
              (fStack_354 - fVar67) * fVar130 + (fStack_350 - fVar104) * fVar132;
  fStack_2e4 = (local_358 - fVar145) * fVar106 +
               (fStack_354 - fVar67) * fVar131 + (fStack_350 - fVar104) * fVar143;
  fVar177 = (local_348 - fVar145) * fVar105 +
            (fStack_344 - fVar67) * fVar130 + (fStack_340 - fVar104) * fVar132;
  fVar204 = (local_348 - fVar145) * fVar106 +
            (fStack_344 - fVar67) * fVar131 + (fStack_340 - fVar104) * fVar143;
  local_2f8 = CONCAT44(fVar204,fVar177);
  local_308 = (local_3b8 - fVar145) * fVar105 +
              (fStack_3b4 - fVar67) * fVar130 + (fStack_3b0 - fVar104) * fVar132;
  fStack_304 = (local_3b8 - fVar145) * fVar106 +
               (fStack_3b4 - fVar67) * fVar131 + (fStack_3b0 - fVar104) * fVar143;
  fVar105 = (local_208 - fVar145) * fVar105 +
            (fStack_204 - fVar67) * fVar130 + (fStack_200 - fVar104) * fVar132;
  fVar67 = (local_208 - fVar145) * fVar106 +
           (fStack_204 - fVar67) * fVar131 + (fStack_200 - fVar104) * fVar143;
  local_318 = CONCAT44(fVar67,fVar105);
  auVar159._8_8_ = local_2f8;
  auVar159._0_8_ = local_2b8;
  auVar304._8_8_ = local_318;
  auVar304._0_8_ = local_2d8;
  auVar88._8_4_ = local_2e8;
  auVar88._0_8_ = local_2a8;
  auVar88._12_4_ = fStack_2e4;
  auVar68 = minps(auVar88,auVar159);
  auVar118._8_4_ = local_308;
  auVar118._0_8_ = local_2c8;
  auVar118._12_4_ = fStack_304;
  auVar134 = minps(auVar118,auVar304);
  auVar68 = minps(auVar68,auVar134);
  auVar119._4_4_ = fVar172;
  auVar119._0_4_ = fVar171;
  auVar119._8_4_ = local_2e8;
  auVar119._12_4_ = fStack_2e4;
  auVar134 = maxps(auVar119,auVar159);
  auVar135._4_4_ = fVar209;
  auVar135._0_4_ = fVar206;
  auVar135._8_4_ = local_308;
  auVar135._12_4_ = fStack_304;
  auVar136 = maxps(auVar135,auVar304);
  auVar120 = maxps(auVar134,auVar136);
  auVar20._4_8_ = auVar136._8_8_;
  auVar20._0_4_ = auVar68._4_4_;
  auVar137._0_8_ = auVar20._0_8_ << 0x20;
  auVar137._8_4_ = auVar68._8_4_;
  auVar137._12_4_ = auVar68._12_4_;
  auVar138._8_8_ = auVar68._8_8_;
  auVar138._0_8_ = auVar137._8_8_;
  auVar134 = minps(auVar68,auVar138);
  auVar21._4_8_ = auVar68._8_8_;
  auVar21._0_4_ = auVar120._4_4_;
  auVar139._0_8_ = auVar21._0_8_ << 0x20;
  auVar139._8_4_ = auVar120._8_4_;
  auVar139._12_4_ = auVar120._12_4_;
  auVar140._8_8_ = auVar120._8_8_;
  auVar140._0_8_ = auVar139._8_8_;
  auVar68 = maxps(auVar120,auVar140);
  auVar89._0_8_ = auVar134._0_8_ & 0x7fffffff7fffffff;
  auVar89._8_4_ = auVar134._8_4_ & 0x7fffffff;
  auVar89._12_4_ = auVar134._12_4_ & 0x7fffffff;
  auVar121._0_8_ = auVar68._0_8_ & 0x7fffffff7fffffff;
  auVar121._8_4_ = auVar68._8_4_ & 0x7fffffff;
  auVar121._12_4_ = auVar68._12_4_ & 0x7fffffff;
  auVar68 = maxps(auVar89,auVar121);
  fVar145 = auVar68._4_4_;
  if (auVar68._4_4_ <= auVar68._0_4_) {
    fVar145 = auVar68._0_4_;
  }
  fVar145 = fVar145 * 9.536743e-07;
  register0x00001488 = local_2a8;
  register0x00001388 = local_2b8;
  register0x000015c8 = local_2c8;
  register0x000013c8 = local_2d8;
  register0x00001548 = local_2f8;
  register0x00001348 = local_318;
  local_138 = fVar145;
  fStack_134 = fVar145;
  fStack_130 = fVar145;
  fStack_12c = fVar145;
  local_148 = -fVar145;
  fStack_144 = -fVar145;
  fStack_140 = -fVar145;
  fStack_13c = -fVar145;
  afStack_1e8[0] = local_2e8;
  afStack_1e8[1] = fStack_2e4;
  local_88 = fVar148 - fVar171;
  fStack_84 = fVar156 - fVar172;
  fStack_80 = fVar177 - local_2e8;
  fStack_7c = fVar204 - fStack_2e4;
  local_98 = fVar206 - fVar148;
  fStack_94 = fVar209 - fVar156;
  fStack_90 = local_308 - fVar177;
  fStack_8c = fStack_304 - fVar204;
  fStack_284 = fStack_304;
  local_288 = local_308;
  uStack_280 = local_2f8;
  local_a8 = fVar157 - fVar206;
  fStack_a4 = fVar158 - fVar209;
  fStack_a0 = fVar105 - local_308;
  fStack_9c = fVar67 - fStack_304;
  local_178 = local_358 - local_368;
  fStack_174 = fStack_354 - fStack_364;
  fStack_170 = fStack_350 - fStack_360;
  fStack_16c = fStack_34c - fStack_35c;
  local_188 = local_348 - local_378;
  fStack_184 = fStack_344 - fStack_374;
  fStack_180 = fStack_340 - fStack_370;
  fStack_17c = fStack_33c - fStack_36c;
  local_198 = local_3b8 - local_398;
  fStack_194 = fStack_3b4 - fStack_394;
  fStack_190 = fStack_3b0 - fStack_390;
  fStack_18c = fStack_3ac - fStack_38c;
  local_1a8 = local_208 - local_388;
  fStack_1a4 = fStack_204 - fStack_384;
  fStack_1a0 = fStack_200 - fStack_380;
  fStack_19c = fStack_1fc - fStack_37c;
  uVar58 = 0;
  uVar56 = 0;
  local_408._4_4_ = 0.0;
  fStack_3fc = 1.0;
  local_408._0_4_ = 0.0;
  fStack_400 = 1.0;
  fStack_300 = local_308;
  fStack_2fc = fStack_304;
  fStack_2e0 = local_2e8;
  fStack_2dc = fStack_2e4;
  local_298 = local_2c8;
  local_278 = (ulong)uVar62;
  local_1f8 = local_2a8;
LAB_00b51f01:
  do {
    fVar104 = 1.0 - (float)local_408._4_4_;
    fVar106 = 1.0 - (float)local_408._4_4_;
    fVar130 = 1.0 - fStack_3fc;
    fVar131 = 1.0 - fStack_3fc;
    fVar214 = local_2a8._0_4_ * fVar104 + local_2e8 * (float)local_408._4_4_;
    fVar311 = local_2a8._4_4_ * fVar106 + fStack_2e4 * (float)local_408._4_4_;
    fVar233 = local_2a8._8_4_ * fVar130 + fStack_2e0 * fStack_3fc;
    fVar241 = local_2a8._12_4_ * fVar131 + fStack_2dc * fStack_3fc;
    fVar132 = local_2b8._0_4_ * fVar104 + local_2f8._0_4_ * (float)local_408._4_4_;
    fVar243 = local_2b8._4_4_ * fVar106 + local_2f8._4_4_ * (float)local_408._4_4_;
    fVar256 = local_2b8._8_4_ * fVar130 + local_2f8._8_4_ * fStack_3fc;
    fVar258 = local_2b8._12_4_ * fVar131 + local_2f8._12_4_ * fStack_3fc;
    fVar273 = local_2c8._0_4_ * fVar104 + local_308 * (float)local_408._4_4_;
    fVar276 = local_2c8._4_4_ * fVar106 + fStack_304 * (float)local_408._4_4_;
    fVar312 = local_2c8._8_4_ * fVar130 + fStack_300 * fStack_3fc;
    fVar318 = local_2c8._12_4_ * fVar131 + fStack_2fc * fStack_3fc;
    fVar242 = fVar104 * local_2d8._0_4_ + (float)local_408._4_4_ * local_318._0_4_;
    fVar261 = fVar106 * local_2d8._4_4_ + (float)local_408._4_4_ * local_318._4_4_;
    fVar294 = fVar130 * local_2d8._8_4_ + fStack_3fc * local_318._8_4_;
    fVar296 = fVar131 * local_2d8._12_4_ + fStack_3fc * local_318._12_4_;
    fVar298 = (fStack_400 - (float)local_408._0_4_) * 0.11111111;
    local_418 = CONCAT44(fStack_400,local_408._0_4_);
    fVar308 = (fStack_400 - (float)local_408._0_4_) * 0.0 + (float)local_408._0_4_;
    fVar309 = (fStack_400 - (float)local_408._0_4_) * 0.33333334 + (float)local_408._0_4_;
    fVar310 = (fStack_400 - (float)local_408._0_4_) * 0.6666667 + (float)local_408._0_4_;
    local_408._0_4_ = (fStack_400 - (float)local_408._0_4_) * 1.0 + (float)local_408._0_4_;
    fVar106 = 1.0 - fVar308;
    fVar131 = 1.0 - fVar309;
    fVar143 = 1.0 - fVar310;
    fVar148 = 1.0 - (float)local_408._0_4_;
    fVar171 = fVar132 * fVar106 + fVar273 * fVar308;
    fVar172 = fVar132 * fVar131 + fVar273 * fVar309;
    fVar177 = fVar132 * fVar143 + fVar273 * fVar310;
    fVar204 = fVar132 * fVar148 + fVar273 * (float)local_408._0_4_;
    fVar206 = fVar243 * fVar106 + fVar276 * fVar308;
    fVar209 = fVar243 * fVar131 + fVar276 * fVar309;
    fVar212 = fVar243 * fVar143 + fVar276 * fVar310;
    fVar213 = fVar243 * fVar148 + fVar276 * (float)local_408._0_4_;
    fVar156 = (fVar214 * fVar106 + fVar132 * fVar308) * fVar106 + fVar308 * fVar171;
    fVar104 = (fVar214 * fVar131 + fVar132 * fVar309) * fVar131 + fVar309 * fVar172;
    fVar130 = (fVar214 * fVar143 + fVar132 * fVar310) * fVar143 + fVar310 * fVar177;
    fVar132 = (fVar214 * fVar148 + fVar132 * (float)local_408._0_4_) * fVar148 +
              (float)local_408._0_4_ * fVar204;
    fVar214 = (fVar311 * fVar106 + fVar243 * fVar308) * fVar106 + fVar308 * fVar206;
    fVar228 = (fVar311 * fVar131 + fVar243 * fVar309) * fVar131 + fVar309 * fVar209;
    fVar230 = (fVar311 * fVar143 + fVar243 * fVar310) * fVar143 + fVar310 * fVar212;
    fVar243 = (fVar311 * fVar148 + fVar243 * (float)local_408._0_4_) * fVar148 +
              (float)local_408._0_4_ * fVar213;
    fVar171 = fVar171 * fVar106 + (fVar273 * fVar106 + fVar242 * fVar308) * fVar308;
    fVar172 = fVar172 * fVar131 + (fVar273 * fVar131 + fVar242 * fVar309) * fVar309;
    fVar177 = fVar177 * fVar143 + (fVar273 * fVar143 + fVar242 * fVar310) * fVar310;
    fVar204 = fVar204 * fVar148 +
              (fVar273 * fVar148 + fVar242 * (float)local_408._0_4_) * (float)local_408._0_4_;
    fVar206 = fVar206 * fVar106 + (fVar276 * fVar106 + fVar261 * fVar308) * fVar308;
    fVar209 = fVar209 * fVar131 + (fVar276 * fVar131 + fVar261 * fVar309) * fVar309;
    fVar212 = fVar212 * fVar143 + (fVar276 * fVar143 + fVar261 * fVar310) * fVar310;
    fVar213 = fVar213 * fVar148 +
              (fVar276 * fVar148 + fVar261 * (float)local_408._0_4_) * (float)local_408._0_4_;
    local_238 = fVar106 * fVar156 + fVar308 * fVar171;
    fStack_234 = fVar131 * fVar104 + fVar309 * fVar172;
    fStack_230 = fVar143 * fVar130 + fVar310 * fVar177;
    fStack_22c = fVar148 * fVar132 + (float)local_408._0_4_ * fVar204;
    local_128 = fVar106 * fVar214 + fVar308 * fVar206;
    fStack_124 = fVar131 * fVar228 + fVar309 * fVar209;
    fStack_120 = fVar143 * fVar230 + fVar310 * fVar212;
    fStack_11c = fVar148 * fVar243 + (float)local_408._0_4_ * fVar213;
    fVar172 = (fVar172 - fVar104) * 3.0 * fVar298;
    fVar177 = (fVar177 - fVar130) * 3.0 * fVar298;
    fVar204 = (fVar204 - fVar132) * 3.0 * fVar298;
    fVar104 = (fVar209 - fVar228) * 3.0 * fVar298;
    fVar130 = (fVar212 - fVar230) * 3.0 * fVar298;
    fVar132 = (fVar213 - fVar243) * 3.0 * fVar298;
    local_3a8._4_4_ = fStack_230;
    local_3a8._0_4_ = fStack_234;
    local_3a8._8_4_ = fStack_22c;
    local_3a8._12_4_ = 0;
    local_c8._4_4_ = fStack_120;
    local_c8._0_4_ = fStack_124;
    local_218 = local_238 + (fVar171 - fVar156) * 3.0 * fVar298;
    fStack_214 = fStack_234 + fVar172;
    fStack_210 = fStack_230 + fVar177;
    fStack_20c = fStack_22c + fVar204;
    local_328._0_4_ = local_128 + (fVar206 - fVar214) * 3.0 * fVar298;
    local_328._4_4_ = fStack_124 + fVar104;
    fStack_320 = fStack_120 + fVar130;
    fStack_31c = fStack_11c + fVar132;
    local_228._0_4_ = fStack_234 - fVar172;
    local_228._4_4_ = fStack_230 - fVar177;
    local_228._8_4_ = fStack_22c - fVar204;
    local_228._12_4_ = 0;
    fVar104 = fStack_124 - fVar104;
    fVar130 = fStack_120 - fVar130;
    fVar132 = fStack_11c - fVar132;
    fVar156 = fVar256 * fVar106 + fVar312 * fVar308;
    fVar171 = fVar256 * fVar131 + fVar312 * fVar309;
    fVar172 = fVar256 * fVar143 + fVar312 * fVar310;
    fVar177 = fVar256 * fVar148 + fVar312 * (float)local_408._0_4_;
    fVar204 = fVar258 * fVar106 + fVar318 * fVar308;
    fVar206 = fVar258 * fVar131 + fVar318 * fVar309;
    fVar209 = fVar258 * fVar143 + fVar318 * fVar310;
    fVar212 = fVar258 * fVar148 + fVar318 * (float)local_408._0_4_;
    fVar213 = (fVar233 * fVar106 + fVar256 * fVar308) * fVar106 + fVar308 * fVar156;
    fVar214 = (fVar233 * fVar131 + fVar256 * fVar309) * fVar131 + fVar309 * fVar171;
    fVar228 = (fVar233 * fVar143 + fVar256 * fVar310) * fVar143 + fVar310 * fVar172;
    fVar230 = (fVar233 * fVar148 + fVar256 * (float)local_408._0_4_) * fVar148 +
              (float)local_408._0_4_ * fVar177;
    fVar273 = (fVar241 * fVar106 + fVar258 * fVar308) * fVar106 + fVar308 * fVar204;
    fVar276 = (fVar241 * fVar131 + fVar258 * fVar309) * fVar131 + fVar309 * fVar206;
    fVar281 = (fVar241 * fVar143 + fVar258 * fVar310) * fVar143 + fVar310 * fVar209;
    fVar292 = (fVar241 * fVar148 + fVar258 * (float)local_408._0_4_) * fVar148 +
              (float)local_408._0_4_ * fVar212;
    fVar243 = fVar156 * fVar106 + (fVar312 * fVar106 + fVar294 * fVar308) * fVar308;
    fVar256 = fVar171 * fVar131 + (fVar312 * fVar131 + fVar294 * fVar309) * fVar309;
    fVar258 = fVar172 * fVar143 + (fVar312 * fVar143 + fVar294 * fVar310) * fVar310;
    fVar311 = fVar177 * fVar148 +
              (fVar312 * fVar148 + fVar294 * (float)local_408._0_4_) * (float)local_408._0_4_;
    fVar233 = fVar204 * fVar106 + (fVar318 * fVar106 + fVar296 * fVar308) * fVar308;
    fVar241 = fVar206 * fVar131 + (fVar318 * fVar131 + fVar296 * fVar309) * fVar309;
    fVar242 = fVar209 * fVar143 + (fVar318 * fVar143 + fVar296 * fVar310) * fVar310;
    fVar261 = fVar212 * fVar148 +
              (fVar318 * fVar148 + fVar296 * (float)local_408._0_4_) * (float)local_408._0_4_;
    fVar204 = fVar106 * fVar213 + fVar308 * fVar243;
    fVar206 = fVar131 * fVar214 + fVar309 * fVar256;
    fVar209 = fVar143 * fVar228 + fVar310 * fVar258;
    fVar212 = fVar148 * fVar230 + (float)local_408._0_4_ * fVar311;
    fVar156 = fVar106 * fVar273 + fVar308 * fVar233;
    fVar171 = fVar131 * fVar276 + fVar309 * fVar241;
    fVar172 = fVar143 * fVar281 + fVar310 * fVar242;
    fVar177 = fVar148 * fVar292 + (float)local_408._0_4_ * fVar261;
    fVar106 = (fVar256 - fVar214) * 3.0 * fVar298;
    fVar131 = (fVar258 - fVar228) * 3.0 * fVar298;
    fVar143 = (fVar311 - fVar230) * 3.0 * fVar298;
    fVar148 = (fVar241 - fVar276) * 3.0 * fVar298;
    fVar214 = (fVar242 - fVar281) * 3.0 * fVar298;
    fVar228 = (fVar261 - fVar292) * 3.0 * fVar298;
    local_d8._4_4_ = fVar209;
    local_d8._0_4_ = fVar206;
    local_d8._8_4_ = fVar212;
    local_d8._12_4_ = 0;
    local_f8._4_4_ = fVar172;
    local_f8._0_4_ = fVar171;
    local_f8._8_4_ = fVar177;
    local_f8._12_4_ = 0;
    local_118 = fVar204 + (fVar243 - fVar213) * 3.0 * fVar298;
    fStack_114 = fVar206 + fVar106;
    fStack_110 = fVar209 + fVar131;
    fStack_10c = fVar212 + fVar143;
    local_e8 = fVar156 + (fVar233 - fVar273) * 3.0 * fVar298;
    fStack_e4 = fVar171 + fVar148;
    fStack_e0 = fVar172 + fVar214;
    fStack_dc = fVar177 + fVar228;
    local_b8._0_4_ = fVar206 - fVar106;
    local_b8._4_4_ = fVar209 - fVar131;
    local_b8._8_4_ = fVar212 - fVar143;
    local_b8._12_4_ = 0;
    local_108._0_4_ = fVar171 - fVar148;
    local_108._4_4_ = fVar172 - fVar214;
    local_108._8_4_ = fVar177 - fVar228;
    local_108._12_4_ = 0;
    fVar106 = (fVar206 - fStack_234) + (fVar204 - local_238);
    fVar131 = (fVar209 - fStack_230) + (fVar206 - fStack_234);
    fVar143 = (fVar212 - fStack_22c) + (fVar209 - fStack_230);
    fVar148 = (fVar212 - fStack_22c) + 0.0;
    local_c8._8_4_ = fStack_11c;
    local_c8._12_4_ = 0;
    fVar213 = (fVar171 - fStack_124) + (fVar156 - local_128);
    fVar214 = (fVar172 - fStack_120) + (fVar171 - fStack_124);
    fVar228 = (fVar177 - fStack_11c) + (fVar172 - fStack_120);
    fVar230 = (fVar177 - fStack_11c) + 0.0;
    auVar221._0_8_ =
         CONCAT44(fStack_124 * fVar131 - fStack_234 * fVar214,
                  local_128 * fVar106 - local_238 * fVar213);
    auVar221._8_4_ = fStack_120 * fVar143 - fStack_230 * fVar228;
    auVar221._12_4_ = fStack_11c * fVar148 - fStack_22c * fVar230;
    auVar160._0_4_ = (float)local_328._0_4_ * fVar106 - local_218 * fVar213;
    auVar160._4_4_ = (float)local_328._4_4_ * fVar131 - fStack_214 * fVar214;
    auVar160._8_4_ = fStack_320 * fVar143 - fStack_210 * fVar228;
    auVar160._12_4_ = fStack_31c * fVar148 - fStack_20c * fVar230;
    auVar195._0_8_ =
         CONCAT44(fVar130 * fVar131 - fVar214 * local_228._4_4_,
                  fVar104 * fVar106 - fVar213 * local_228._0_4_);
    auVar195._8_4_ = fVar132 * fVar143 - fVar228 * local_228._8_4_;
    auVar195._12_4_ = fVar148 * 0.0 - fVar230 * 0.0;
    auVar305._0_4_ = fVar106 * fStack_124 - fVar213 * fStack_234;
    auVar305._4_4_ = fVar131 * fStack_120 - fVar214 * fStack_230;
    auVar305._8_4_ = fVar143 * fStack_11c - fVar228 * fStack_22c;
    auVar305._12_4_ = fVar148 * 0.0 - fVar230 * 0.0;
    auVar249._0_8_ =
         CONCAT44(fVar171 * fVar131 - fVar206 * fVar214,fVar156 * fVar106 - fVar204 * fVar213);
    auVar249._8_4_ = fVar172 * fVar143 - fVar209 * fVar228;
    auVar249._12_4_ = fVar177 * fVar148 - fVar212 * fVar230;
    auVar317._0_4_ = local_e8 * fVar106 - local_118 * fVar213;
    auVar317._4_4_ = fStack_e4 * fVar131 - fStack_114 * fVar214;
    auVar317._8_4_ = fStack_e0 * fVar143 - fStack_110 * fVar228;
    auVar317._12_4_ = fStack_dc * fVar148 - fStack_10c * fVar230;
    auVar234._0_8_ =
         CONCAT44(local_108._4_4_ * fVar131 - fVar214 * local_b8._4_4_,
                  local_108._0_4_ * fVar106 - fVar213 * local_b8._0_4_);
    auVar234._8_4_ = local_108._8_4_ * fVar143 - fVar228 * local_b8._8_4_;
    auVar234._12_4_ = fVar148 * 0.0 - fVar230 * 0.0;
    auVar90._0_4_ = fVar106 * fVar171 - fVar213 * fVar206;
    auVar90._4_4_ = fVar131 * fVar172 - fVar214 * fVar209;
    auVar90._8_4_ = fVar143 * fVar177 - fVar228 * fVar212;
    auVar90._12_4_ = fVar148 * 0.0 - fVar230 * 0.0;
    auVar122._8_4_ = auVar221._8_4_;
    auVar122._0_8_ = auVar221._0_8_;
    auVar122._12_4_ = auVar221._12_4_;
    auVar68 = minps(auVar122,auVar160);
    auVar120 = maxps(auVar221,auVar160);
    auVar161._8_4_ = auVar195._8_4_;
    auVar161._0_8_ = auVar195._0_8_;
    auVar161._12_4_ = auVar195._12_4_;
    auVar134 = minps(auVar161,auVar305);
    auVar68 = minps(auVar68,auVar134);
    auVar134 = maxps(auVar195,auVar305);
    auVar136 = maxps(auVar120,auVar134);
    auVar162._8_4_ = auVar249._8_4_;
    auVar162._0_8_ = auVar249._0_8_;
    auVar162._12_4_ = auVar249._12_4_;
    auVar134 = minps(auVar162,auVar317);
    auVar250 = maxps(auVar249,auVar317);
    auVar196._8_4_ = auVar234._8_4_;
    auVar196._0_8_ = auVar234._0_8_;
    auVar196._12_4_ = auVar234._12_4_;
    auVar120 = minps(auVar196,auVar90);
    auVar134 = minps(auVar134,auVar120);
    auVar68 = minps(auVar68,auVar134);
    auVar134 = maxps(auVar234,auVar90);
    auVar134 = maxps(auVar250,auVar134);
    auVar134 = maxps(auVar136,auVar134);
    auVar222._0_4_ =
         -(uint)(local_148 <= auVar134._0_4_ && auVar68._0_4_ <= local_138) & local_158._0_4_;
    auVar222._4_4_ =
         -(uint)(fStack_144 <= auVar134._4_4_ && auVar68._4_4_ <= fStack_134) & local_158._4_4_;
    auVar222._8_4_ =
         -(uint)(fStack_140 <= auVar134._8_4_ && auVar68._8_4_ <= fStack_130) & local_158._8_4_;
    auVar222._12_4_ =
         -(uint)(fStack_13c <= auVar134._12_4_ && auVar68._12_4_ <= fStack_12c) & local_158._12_4_;
    uVar62 = movmskps((int)uVar53,auVar222);
    uVar53 = (ulong)uVar62;
    if (uVar62 != 0) {
      fVar106 = (fVar206 - fVar204) + (fStack_234 - local_238);
      fVar131 = (fVar209 - fVar206) + (fStack_230 - fStack_234);
      fVar143 = (fVar212 - fVar209) + (fStack_22c - fStack_230);
      fVar148 = (0.0 - fVar212) + (0.0 - fStack_22c);
      fVar213 = (fVar171 - fVar156) + (fStack_124 - local_128);
      fVar214 = (fVar172 - fVar171) + (fStack_120 - fStack_124);
      fVar228 = (fVar177 - fVar172) + (fStack_11c - fStack_120);
      fVar230 = (0.0 - fVar177) + (0.0 - fStack_11c);
      auVar324._0_8_ =
           CONCAT44(fStack_124 * fVar131 - fStack_234 * fVar214,
                    local_128 * fVar106 - local_238 * fVar213);
      auVar324._8_4_ = fStack_120 * fVar143 - fStack_230 * fVar228;
      auVar324._12_4_ = fStack_11c * fVar148 - fStack_22c * fVar230;
      auVar163._0_4_ = (float)local_328._0_4_ * fVar106 - local_218 * fVar213;
      auVar163._4_4_ = (float)local_328._4_4_ * fVar131 - fStack_214 * fVar214;
      auVar163._8_4_ = fStack_320 * fVar143 - fStack_210 * fVar228;
      auVar163._12_4_ = fStack_31c * fVar148 - fStack_20c * fVar230;
      auVar235._0_8_ =
           CONCAT44(fVar130 * fVar131 - local_228._4_4_ * fVar214,
                    fVar104 * fVar106 - local_228._0_4_ * fVar213);
      auVar235._8_4_ = fVar132 * fVar143 - local_228._8_4_ * fVar228;
      auVar235._12_4_ = fVar148 * 0.0 - fVar230 * 0.0;
      auVar197._0_4_ = fStack_124 * fVar106 - fStack_234 * fVar213;
      auVar197._4_4_ = fStack_120 * fVar131 - fStack_230 * fVar214;
      auVar197._8_4_ = fStack_11c * fVar143 - fStack_22c * fVar228;
      auVar197._12_4_ = fVar148 * 0.0 - fVar230 * 0.0;
      auVar141._0_8_ =
           CONCAT44(fVar171 * fVar131 - fVar206 * fVar214,fVar156 * fVar106 - fVar204 * fVar213);
      auVar141._8_4_ = fVar172 * fVar143 - fVar209 * fVar228;
      auVar141._12_4_ = fVar177 * fVar148 - fVar212 * fVar230;
      auVar268._0_4_ = local_e8 * fVar106 - local_118 * fVar213;
      auVar268._4_4_ = fStack_e4 * fVar131 - fStack_114 * fVar214;
      auVar268._8_4_ = fStack_e0 * fVar143 - fStack_110 * fVar228;
      auVar268._12_4_ = fStack_dc * fVar148 - fStack_10c * fVar230;
      auVar306._0_8_ =
           CONCAT44(local_108._4_4_ * fVar131 - local_b8._4_4_ * fVar214,
                    local_108._0_4_ * fVar106 - local_b8._0_4_ * fVar213);
      auVar306._8_4_ = local_108._8_4_ * fVar143 - local_b8._8_4_ * fVar228;
      auVar306._12_4_ = fVar148 * 0.0 - fVar230 * 0.0;
      auVar91._0_4_ = fVar106 * fVar171 - fVar213 * fVar206;
      auVar91._4_4_ = fVar131 * fVar172 - fVar214 * fVar209;
      auVar91._8_4_ = fVar143 * fVar177 - fVar228 * fVar212;
      auVar91._12_4_ = fVar148 * 0.0 - fVar230 * 0.0;
      auVar123._8_4_ = auVar324._8_4_;
      auVar123._0_8_ = auVar324._0_8_;
      auVar123._12_4_ = auVar324._12_4_;
      auVar68 = minps(auVar123,auVar163);
      auVar120 = maxps(auVar324,auVar163);
      auVar164._8_4_ = auVar235._8_4_;
      auVar164._0_8_ = auVar235._0_8_;
      auVar164._12_4_ = auVar235._12_4_;
      auVar134 = minps(auVar164,auVar197);
      auVar68 = minps(auVar68,auVar134);
      auVar134 = maxps(auVar235,auVar197);
      auVar250 = maxps(auVar120,auVar134);
      auVar165._8_4_ = auVar141._8_4_;
      auVar165._0_8_ = auVar141._0_8_;
      auVar165._12_4_ = auVar141._12_4_;
      auVar120 = minps(auVar165,auVar268);
      auVar134 = maxps(auVar141,auVar268);
      auVar198._8_4_ = auVar306._8_4_;
      auVar198._0_8_ = auVar306._0_8_;
      auVar198._12_4_ = auVar306._12_4_;
      auVar136 = minps(auVar198,auVar91);
      auVar120 = minps(auVar120,auVar136);
      auVar68 = minps(auVar68,auVar120);
      auVar120 = maxps(auVar306,auVar91);
      auVar134 = maxps(auVar134,auVar120);
      auVar134 = maxps(auVar250,auVar134);
      auVar325._0_4_ =
           -(uint)(local_148 <= auVar134._0_4_ && auVar68._0_4_ <= local_138) & auVar222._0_4_;
      auVar325._4_4_ =
           -(uint)(fStack_144 <= auVar134._4_4_ && auVar68._4_4_ <= fStack_134) & auVar222._4_4_;
      auVar325._8_4_ =
           -(uint)(fStack_140 <= auVar134._8_4_ && auVar68._8_4_ <= fStack_130) & auVar222._8_4_;
      auVar325._12_4_ =
           -(uint)(fStack_13c <= auVar134._12_4_ && auVar68._12_4_ <= fStack_12c) & auVar222._12_4_;
      uVar62 = movmskps(uVar62,auVar325);
      uVar53 = (ulong)uVar62;
      auVar317 = local_f8;
      if (uVar62 != 0) {
        uVar53 = (ulong)(byte)uVar62;
        afStack_1e8[uVar56] = (float)(uVar62 & 0xff);
        *(undefined8 *)(afStack_78 + uVar56 * 2) = local_418;
        *(ulong *)(afStack_58 + uVar56 * 2) = CONCAT44(fStack_3fc,local_408._4_4_);
        uVar56 = (ulong)((int)uVar56 + 1);
      }
    }
LAB_00b52573:
    if ((int)uVar56 == 0) {
      if ((uVar58 & 1) != 0) goto LAB_00b536a4;
      fVar145 = ray->tfar;
      auVar129._4_4_ = -(uint)(fStack_164 <= fVar145);
      auVar129._0_4_ = -(uint)(local_168 <= fVar145);
      auVar129._8_4_ = -(uint)(fStack_160 <= fVar145);
      auVar129._12_4_ = -(uint)(fStack_15c <= fVar145);
      uVar62 = movmskps((int)uVar53,auVar129);
      uVar60 = uVar60 & uVar60 + 0xf & uVar62;
      if (uVar60 != 0) goto LAB_00b51194;
      goto LAB_00b536a4;
    }
    uVar62 = (int)uVar56 - 1;
    uVar53 = (ulong)uVar62;
    fVar104 = afStack_1e8[uVar53];
    local_408._4_4_ = afStack_58[uVar53 * 2];
    fStack_3fc = afStack_58[uVar53 * 2 + 1];
    uVar5 = 0;
    if (fVar104 != 0.0) {
      for (; ((uint)fVar104 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    fVar104 = (float)((int)fVar104 - 1U & (uint)fVar104);
    afStack_1e8[uVar53] = fVar104;
    if (fVar104 == 0.0) {
      uVar56 = (ulong)uVar62;
    }
    fVar130 = (float)(uVar5 + 1) * 0.33333334;
    fVar104 = afStack_78[uVar53 * 2];
    fVar106 = afStack_78[uVar53 * 2 + 1];
    local_408._0_4_ =
         fVar104 * (1.0 - (float)uVar5 * 0.33333334) + fVar106 * (float)uVar5 * 0.33333334;
    fStack_400 = fVar104 * (1.0 - fVar130) + fVar106 * fVar130;
    fVar130 = fVar104 * 0.0 + fVar106 * 0.0;
    fVar106 = fVar104 * 0.0 + fVar106 * 0.0;
    fVar104 = fStack_400 - (float)local_408._0_4_;
    if (fVar104 < 0.16666667) {
      fVar204 = 1.0 - (float)local_408._4_4_;
      fVar206 = 1.0 - (float)local_408._4_4_;
      fVar209 = 1.0 - fStack_3fc;
      fVar212 = 1.0 - fStack_3fc;
      fVar131 = (float)local_2a8._0_4_ * fVar204 + local_2e8 * (float)local_408._4_4_;
      fVar132 = (float)local_2a8._4_4_ * fVar206 + fStack_2e4 * (float)local_408._4_4_;
      fVar143 = fStack_2a0 * fVar209 + fStack_2e0 * fStack_3fc;
      fVar148 = fStack_29c * fVar212 + fStack_2dc * fStack_3fc;
      fVar156 = (float)local_2b8._0_4_ * fVar204 + (float)local_2f8._0_4_ * (float)local_408._4_4_;
      fVar171 = (float)local_2b8._4_4_ * fVar206 + (float)local_2f8._4_4_ * (float)local_408._4_4_;
      fVar172 = fStack_2b0 * fVar209 + fStack_2f0 * fStack_3fc;
      fVar177 = fStack_2ac * fVar212 + fStack_2ec * fStack_3fc;
      fVar233 = (float)local_2c8._0_4_ * fVar204 + local_308 * (float)local_408._4_4_;
      fVar242 = (float)local_2c8._4_4_ * fVar206 + fStack_304 * (float)local_408._4_4_;
      fVar273 = fStack_2c0 * fVar209 + fStack_300 * fStack_3fc;
      fVar281 = fStack_2bc * fVar212 + fStack_2fc * fStack_3fc;
      fVar243 = (fVar204 * (float)local_2d8._0_4_ + (float)local_408._4_4_ * (float)local_318._0_4_)
                - fVar233;
      fVar256 = (fVar206 * (float)local_2d8._4_4_ + (float)local_408._4_4_ * (float)local_318._4_4_)
                - fVar242;
      fVar258 = (fVar209 * fStack_2d0 + fStack_3fc * fStack_310) - fVar273;
      fVar311 = (fVar212 * fStack_2cc + fStack_3fc * fStack_30c) - fVar281;
      fVar213 = (float)local_408._0_4_ * (fVar233 - fVar156) + fVar156;
      fVar214 = (float)local_408._0_4_ * (fVar242 - fVar171) + fVar171;
      fVar228 = (float)local_408._0_4_ * (fVar273 - fVar172) + fVar172;
      fVar230 = (float)local_408._0_4_ * (fVar281 - fVar177) + fVar177;
      fVar241 = (fVar233 - fVar156) * fStack_400 + fVar156;
      fVar261 = (fVar242 - fVar171) * fStack_400 + fVar171;
      fVar276 = (fVar273 - fVar172) * fStack_400 + fVar172;
      fVar292 = (fVar281 - fVar177) * fStack_400 + fVar177;
      fVar204 = (float)local_408._0_4_ * (fVar156 - fVar131) + fVar131;
      fVar206 = (float)local_408._0_4_ * (fVar171 - fVar132) + fVar132;
      fVar209 = (float)local_408._0_4_ * (fVar172 - fVar143) + fVar143;
      fVar212 = (float)local_408._0_4_ * (fVar177 - fVar148) + fVar148;
      fVar204 = (fVar213 - fVar204) * (float)local_408._0_4_ + fVar204;
      fVar206 = (fVar214 - fVar206) * (float)local_408._0_4_ + fVar206;
      fVar209 = (fVar228 - fVar209) * (float)local_408._0_4_ + fVar209;
      fVar212 = (fVar230 - fVar212) * (float)local_408._0_4_ + fVar212;
      fVar213 = ((((float)local_408._0_4_ * fVar243 + fVar233) - fVar213) * (float)local_408._0_4_ +
                fVar213) - fVar204;
      fVar214 = ((((float)local_408._0_4_ * fVar256 + fVar242) - fVar214) * (float)local_408._0_4_ +
                fVar214) - fVar206;
      fVar228 = ((((float)local_408._0_4_ * fVar258 + fVar273) - fVar228) * (float)local_408._0_4_ +
                fVar228) - fVar209;
      fVar230 = ((((float)local_408._0_4_ * fVar311 + fVar281) - fVar230) * (float)local_408._0_4_ +
                fVar230) - fVar212;
      fVar204 = (float)local_408._0_4_ * fVar213 + fVar204;
      fVar206 = (float)local_408._0_4_ * fVar214 + fVar206;
      fVar209 = (float)local_408._0_4_ * fVar228 + fVar209;
      fVar212 = (float)local_408._0_4_ * fVar230 + fVar212;
      fVar131 = (fVar156 - fVar131) * fStack_400 + fVar131;
      fVar132 = (fVar171 - fVar132) * fStack_400 + fVar132;
      fVar143 = (fVar172 - fVar143) * fStack_400 + fVar143;
      fVar148 = (fVar177 - fVar148) * fStack_400 + fVar148;
      fVar131 = (fVar241 - fVar131) * fStack_400 + fVar131;
      fVar132 = (fVar261 - fVar132) * fStack_400 + fVar132;
      fVar143 = (fVar276 - fVar143) * fStack_400 + fVar143;
      fVar148 = (fVar292 - fVar148) * fStack_400 + fVar148;
      fVar156 = (((fVar243 * fStack_400 + fVar233) - fVar241) * fStack_400 + fVar241) - fVar131;
      fVar171 = (((fVar256 * fStack_400 + fVar242) - fVar261) * fStack_400 + fVar261) - fVar132;
      fVar172 = (((fVar258 * fStack_400 + fVar273) - fVar276) * fStack_400 + fVar276) - fVar143;
      fVar177 = (((fVar311 * fStack_400 + fVar281) - fVar292) * fStack_400 + fVar292) - fVar148;
      auVar166._0_4_ = fStack_400 * fVar156 + fVar131;
      auVar166._4_4_ = fStack_400 * fVar171 + fVar132;
      auVar166._8_4_ = fStack_400 * fVar172 + fVar143;
      auVar166._12_4_ = fStack_400 * fVar177 + fVar148;
      fVar131 = fVar104 * 0.33333334;
      fVar213 = fVar213 * 3.0 * fVar131 + fVar204;
      fVar214 = fVar214 * 3.0 * fVar131 + fVar206;
      fVar228 = fVar228 * 3.0 * fVar131 + fVar209;
      fVar230 = fVar230 * 3.0 * fVar131 + fVar212;
      fVar243 = auVar166._0_4_ - fVar131 * fVar156 * 3.0;
      fVar256 = auVar166._4_4_ - fVar131 * fVar171 * 3.0;
      fVar258 = auVar166._8_4_ - fVar131 * fVar172 * 3.0;
      fVar311 = auVar166._12_4_ - fVar131 * fVar177 * 3.0;
      auVar22._4_8_ = auVar317._8_8_;
      auVar22._0_4_ = auVar166._4_4_;
      auVar314._0_8_ = auVar22._0_8_ << 0x20;
      auVar314._8_4_ = auVar166._8_4_;
      auVar314._12_4_ = auVar166._12_4_;
      auVar315._8_8_ = auVar166._8_8_;
      auVar315._0_8_ = auVar314._8_8_;
      fVar156 = (auVar166._8_4_ - auVar166._0_4_) + (fVar209 - fVar204);
      fVar171 = (auVar166._12_4_ - auVar166._4_4_) + (fVar212 - fVar206);
      auVar251._0_4_ = fVar256 * fVar171;
      auVar251._4_4_ = fVar256 * fVar171;
      auVar251._8_4_ = fVar311 * fVar171;
      auVar251._12_4_ = fVar311 * fVar171;
      fVar131 = fVar204 * fVar156 + fVar206 * fVar171;
      fVar132 = fVar209 * fVar156 + fVar212 * fVar171;
      fVar172 = fVar213 * fVar156 + fVar214 * fVar171;
      fVar177 = fVar228 * fVar156 + fVar230 * fVar171;
      fVar233 = fVar243 * fVar156 + auVar251._0_4_;
      auVar223._0_8_ = CONCAT44(fVar256 * fVar156 + auVar251._4_4_,fVar233);
      auVar223._8_4_ = fVar258 * fVar156 + auVar251._8_4_;
      auVar223._12_4_ = fVar311 * fVar156 + auVar251._12_4_;
      fVar148 = fVar156 * auVar166._0_4_ + fVar171 * auVar166._4_4_;
      fVar241 = fVar156 * auVar166._8_4_ + fVar171 * auVar166._12_4_;
      auVar23._4_8_ = auVar251._8_8_;
      auVar23._0_4_ = fVar214 * fVar156 + fVar214 * fVar171;
      auVar252._0_8_ = auVar23._0_8_ << 0x20;
      auVar252._8_4_ = fVar177;
      auVar252._12_4_ = fVar230 * fVar156 + fVar230 * fVar171;
      fVar143 = fVar172;
      if (fVar172 <= fVar131) {
        fVar143 = fVar131;
        fVar131 = fVar172;
      }
      auVar253._8_8_ = auVar252._8_8_;
      auVar253._0_8_ = auVar253._8_8_;
      auVar92._8_4_ = auVar223._8_4_;
      auVar92._0_8_ = auVar223._0_8_;
      auVar92._12_4_ = auVar223._12_4_;
      if (fVar148 <= fVar233) {
        auVar92._0_4_ = fVar148;
      }
      if (auVar92._0_4_ <= fVar131) {
        fVar131 = auVar92._0_4_;
      }
      auVar24._4_8_ = auVar92._8_8_;
      auVar24._0_4_ = fVar156 * auVar166._4_4_ + fVar171 * auVar166._4_4_;
      auVar93._0_8_ = auVar24._0_8_ << 0x20;
      auVar93._8_4_ = fVar241;
      auVar93._12_4_ = fVar156 * auVar166._12_4_ + fVar171 * auVar166._12_4_;
      if (fVar148 <= fVar233) {
        fVar148 = fVar233;
      }
      auVar94._8_8_ = auVar93._8_8_;
      auVar94._0_8_ = auVar94._8_8_;
      if (fVar148 <= fVar143) {
        fVar148 = fVar143;
      }
      if (fVar177 <= fVar132) {
        auVar253._0_4_ = fVar132;
        fVar132 = fVar177;
      }
      auVar124._8_4_ = auVar223._8_4_;
      auVar124._0_8_ = auVar223._8_8_;
      auVar124._12_4_ = auVar223._12_4_;
      if (fVar241 <= auVar223._8_4_) {
        auVar124._0_4_ = fVar241;
      }
      if (auVar124._0_4_ <= fVar132) {
        fVar132 = auVar124._0_4_;
      }
      if (fVar241 <= auVar223._8_4_) {
        auVar94._0_4_ = auVar223._8_4_;
      }
      if (auVar94._0_4_ <= auVar253._0_4_) {
        auVar94._0_4_ = auVar253._0_4_;
      }
      bVar59 = 3 < (uint)uVar56;
      uVar25 = (undefined3)(uVar62 >> 8);
      uVar53 = (ulong)CONCAT31(uVar25,bVar59);
      fVar143 = auVar94._0_4_;
      if ((0.0001 <= fVar131) || (fVar143 <= -0.0001)) break;
      goto LAB_00b528d6;
    }
  } while( true );
  if ((fVar132 < 0.0001 && -0.0001 < fVar148) ||
     ((fVar131 < 0.0001 && -0.0001 < fVar148 ||
      (auVar317 = auVar315, fVar132 < 0.0001 && -0.0001 < fVar143)))) {
LAB_00b528d6:
    bVar59 = bVar59 || fVar104 < 0.001;
    uVar53 = (ulong)CONCAT31(uVar25,bVar59);
    fVar171 = (float)(~-(uint)(fVar131 < 0.0) & 0x3f800000 | -(uint)(fVar131 < 0.0) & 0xbf800000);
    fVar172 = (float)(~-(uint)(fVar148 < 0.0) & 0x3f800000 | -(uint)(fVar148 < 0.0) & 0xbf800000);
    fVar156 = 0.0;
    if ((fVar171 == fVar172) && (!NAN(fVar171) && !NAN(fVar172))) {
      fVar156 = INFINITY;
    }
    fVar177 = 0.0;
    if ((fVar171 == fVar172) && (!NAN(fVar171) && !NAN(fVar172))) {
      fVar177 = -INFINITY;
    }
    fVar233 = (float)(~-(uint)(fVar132 < 0.0) & 0x3f800000 | -(uint)(fVar132 < 0.0) & 0xbf800000);
    if ((fVar171 != fVar233) || (fVar241 = fVar177, NAN(fVar171) || NAN(fVar233))) {
      if ((fVar132 != fVar131) || (NAN(fVar132) || NAN(fVar131))) {
        fVar132 = -fVar131 / (fVar132 - fVar131);
        fVar132 = (1.0 - fVar132) * 0.0 + fVar132;
        fVar241 = fVar132;
      }
      else {
        fVar132 = 0.0;
        if ((fVar131 != 0.0) || (fVar241 = 1.0, NAN(fVar131))) {
          fVar132 = INFINITY;
          fVar241 = -INFINITY;
        }
      }
      if (fVar132 <= fVar156) {
        fVar156 = fVar132;
      }
      if (fVar241 <= fVar177) {
        fVar241 = fVar177;
      }
    }
    fVar131 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar143 < 0.0) * 4);
    if ((fVar172 != fVar131) || (fVar132 = fVar241, NAN(fVar172) || NAN(fVar131))) {
      if ((fVar143 != fVar148) || (NAN(fVar143) || NAN(fVar148))) {
        fVar171 = -fVar148 / (fVar143 - fVar148);
        fVar171 = (1.0 - fVar171) * 0.0 + fVar171;
        fVar132 = fVar171;
      }
      else {
        fVar171 = 0.0;
        if ((fVar148 != 0.0) || (fVar132 = 1.0, NAN(fVar148))) {
          fVar171 = INFINITY;
          fVar132 = -INFINITY;
        }
      }
      if (fVar171 <= fVar156) {
        fVar156 = fVar171;
      }
      if (fVar132 <= fVar241) {
        fVar132 = fVar241;
      }
    }
    if ((fVar233 != fVar131) || (NAN(fVar233) || NAN(fVar131))) {
      fVar156 = (float)(~-(uint)(fVar156 < 1.0) & 0x3f800000 |
                       (uint)fVar156 & -(uint)(fVar156 < 1.0));
      fVar132 = (float)(~-(uint)(fVar132 < 1.0) & (uint)fVar132 |
                       -(uint)(fVar132 < 1.0) & 0x3f800000);
    }
    fVar148 = SUB164(ZEXT816(0x3f80000000000000),4);
    uVar62 = -(uint)(fVar132 < fVar148);
    fVar156 = (float)(~-(uint)(fVar156 < 0.0) & (uint)fVar156);
    fVar131 = (float)(~uVar62 & 0x3f800000 | (uint)fVar132 & uVar62);
    auVar317 = ZEXT816(0x3f80000000000000);
    _local_328 = auVar315;
    if (fVar156 <= fVar131) {
      fVar156 = fVar156 + -0.1;
      fVar131 = fVar131 + 0.1;
      uVar62 = -(uint)(fVar131 < fVar148);
      fVar156 = (float)(~-(uint)(fVar156 < 0.0) & (uint)fVar156);
      fVar131 = (float)(~uVar62 & 0x3f800000 | (uint)fVar131 & uVar62);
      fVar233 = 1.0 - fVar156;
      fVar241 = 1.0 - fVar156;
      fVar242 = 1.0 - fVar131;
      fVar261 = 1.0 - fVar131;
      fVar132 = fVar204 * fVar233 + fVar209 * fVar156;
      fVar148 = fVar206 * fVar241 + fVar212 * fVar156;
      fVar171 = fVar204 * fVar242 + fVar209 * fVar131;
      fVar172 = fVar206 * fVar261 + fVar212 * fVar131;
      fVar177 = fVar213 * fVar233 + fVar228 * fVar156;
      fVar204 = fVar214 * fVar241 + fVar230 * fVar156;
      fVar206 = fVar213 * fVar242 + fVar228 * fVar131;
      fVar209 = fVar214 * fVar261 + fVar230 * fVar131;
      fVar212 = fVar243 * fVar233 + fVar258 * fVar156;
      fVar213 = fVar256 * fVar241 + fVar311 * fVar156;
      fVar214 = fVar243 * fVar242 + fVar258 * fVar131;
      fVar228 = fVar256 * fVar261 + fVar311 * fVar131;
      fVar230 = fVar233 * auVar166._0_4_ + auVar166._8_4_ * fVar156;
      fVar243 = fVar241 * auVar166._4_4_ + auVar166._12_4_ * fVar156;
      fVar256 = fVar242 * auVar166._0_4_ + auVar166._8_4_ * fVar131;
      fVar258 = fVar261 * auVar166._4_4_ + auVar166._12_4_ * fVar131;
      fVar311 = (float)local_408._4_4_ * (1.0 - fVar131);
      local_408._4_4_ = (float)local_408._4_4_ * (1.0 - fVar156) + fStack_3fc * fVar156;
      fStack_3fc = fVar311 + fStack_3fc * fVar131;
      fVar104 = 1.0 / fVar104;
      auVar125._0_4_ = fVar256 - fVar230;
      auVar125._4_4_ = fVar258 - fVar243;
      auVar125._8_4_ = fVar256 - fVar256;
      auVar125._12_4_ = fVar258 - fVar258;
      auVar154._0_8_ = CONCAT44(fVar228 - fVar213,fVar214 - fVar212);
      auVar154._8_4_ = fVar214 - fVar214;
      auVar154._12_4_ = fVar228 - fVar228;
      auVar199._0_4_ = fVar206 - fVar177;
      auVar199._4_4_ = fVar209 - fVar204;
      auVar199._8_4_ = fVar206 - fVar206;
      auVar199._12_4_ = fVar209 - fVar209;
      auVar254._0_8_ = CONCAT44((fVar204 - fVar148) * 3.0,(fVar177 - fVar132) * 3.0);
      auVar254._8_4_ = (fVar206 - fVar171) * 3.0;
      auVar254._12_4_ = (fVar209 - fVar172) * 3.0;
      auVar167._0_8_ = CONCAT44((fVar213 - fVar204) * 3.0,(fVar212 - fVar177) * 3.0);
      auVar167._8_4_ = (fVar214 - fVar206) * 3.0;
      auVar167._12_4_ = (fVar228 - fVar209) * 3.0;
      auVar288._0_4_ = (fVar230 - fVar212) * 3.0;
      auVar288._4_4_ = (fVar243 - fVar213) * 3.0;
      auVar288._8_4_ = (fVar256 - fVar214) * 3.0;
      auVar288._12_4_ = (fVar258 - fVar228) * 3.0;
      auVar224._8_4_ = auVar167._8_4_;
      auVar224._0_8_ = auVar167._0_8_;
      auVar224._12_4_ = auVar167._12_4_;
      auVar134 = minps(auVar224,auVar288);
      auVar68 = maxps(auVar167,auVar288);
      auVar269._8_4_ = auVar254._8_4_;
      auVar269._0_8_ = auVar254._0_8_;
      auVar269._12_4_ = auVar254._12_4_;
      auVar136 = minps(auVar269,auVar134);
      auVar120 = maxps(auVar254,auVar68);
      auVar26._4_8_ = auVar68._8_8_;
      auVar26._0_4_ = auVar136._4_4_;
      auVar168._0_8_ = auVar26._0_8_ << 0x20;
      auVar168._8_4_ = auVar136._8_4_;
      auVar168._12_4_ = auVar136._12_4_;
      auVar169._8_8_ = auVar136._8_8_;
      auVar169._0_8_ = auVar168._8_8_;
      auVar27._4_8_ = auVar134._8_8_;
      auVar27._0_4_ = auVar120._4_4_;
      auVar225._0_8_ = auVar27._0_8_ << 0x20;
      auVar225._8_4_ = auVar120._8_4_;
      auVar225._12_4_ = auVar120._12_4_;
      auVar226._8_8_ = auVar120._8_8_;
      auVar226._0_8_ = auVar225._8_8_;
      auVar134 = minps(auVar136,auVar169);
      auVar68 = maxps(auVar120,auVar226);
      fVar273 = auVar134._0_4_ * fVar104;
      fVar276 = auVar134._4_4_ * fVar104;
      fVar281 = auVar134._8_4_ * fVar104;
      fVar292 = auVar134._12_4_ * fVar104;
      fVar214 = fVar104 * auVar68._0_4_;
      fVar230 = fVar104 * auVar68._4_4_;
      fVar256 = fVar104 * auVar68._8_4_;
      fVar104 = fVar104 * auVar68._12_4_;
      fVar242 = 1.0 / (fStack_3fc - (float)local_408._4_4_);
      auVar95._0_8_ = CONCAT44(fVar172 - fVar148,fVar171 - fVar132);
      auVar95._8_4_ = fVar171 - fVar171;
      auVar95._12_4_ = fVar172 - fVar172;
      auVar236._8_4_ = auVar95._8_4_;
      auVar236._0_8_ = auVar95._0_8_;
      auVar236._12_4_ = auVar95._12_4_;
      auVar120 = minps(auVar236,auVar199);
      auVar68 = maxps(auVar95,auVar199);
      auVar142._8_4_ = auVar154._8_4_;
      auVar142._0_8_ = auVar154._0_8_;
      auVar142._12_4_ = auVar154._12_4_;
      auVar134 = minps(auVar142,auVar125);
      auVar120 = minps(auVar120,auVar134);
      auVar134 = maxps(auVar154,auVar125);
      auVar68 = maxps(auVar68,auVar134);
      fVar233 = auVar120._0_4_ * fVar242;
      fVar241 = auVar120._4_4_ * fVar242;
      fVar261 = fVar242 * auVar68._0_4_;
      fVar242 = fVar242 * auVar68._4_4_;
      auVar227._4_4_ = fStack_3fc;
      auVar227._0_4_ = fStack_400;
      auVar227._8_4_ = fVar130;
      auVar227._12_4_ = fVar106;
      fVar206 = ((float)local_408._0_4_ + fStack_400) * 0.5;
      fVar209 = ((float)local_408._4_4_ + fStack_3fc) * 0.5;
      fVar212 = (fStack_400 + fVar130) * 0.0;
      fVar213 = (fStack_3fc + fVar106) * 0.0;
      fVar131 = local_88 * fVar206 + (float)local_1f8;
      fVar132 = fStack_84 * fVar206 + local_1f8._4_4_;
      fVar148 = fStack_80 * fVar206 + fStack_1f0;
      fVar156 = fStack_7c * fVar206 + fStack_1ec;
      fVar171 = local_98 * fVar206 + local_288;
      fVar172 = fStack_94 * fVar206 + fStack_284;
      fVar177 = fStack_90 * fVar206 + (float)uStack_280;
      fVar204 = fStack_8c * fVar206 + uStack_280._4_4_;
      fVar131 = (fVar171 - fVar131) * fVar206 + fVar131;
      fVar132 = (fVar172 - fVar132) * fVar206 + fVar132;
      fVar148 = (fVar177 - fVar148) * fVar206 + fVar148;
      fVar156 = (fVar204 - fVar156) * fVar206 + fVar156;
      fVar171 = (((local_a8 * fVar206 + (float)local_298) - fVar171) * fVar206 + fVar171) - fVar131;
      fVar172 = (((fStack_a4 * fVar206 + local_298._4_4_) - fVar172) * fVar206 + fVar172) - fVar132;
      fVar177 = (((fStack_a0 * fVar206 + fStack_290) - fVar177) * fVar206 + fVar177) - fVar148;
      fVar204 = (((fStack_9c * fVar206 + fStack_28c) - fVar204) * fVar206 + fVar204) - fVar156;
      fVar131 = fVar206 * fVar171 + fVar131;
      fVar132 = fVar206 * fVar172 + fVar132;
      fVar171 = fVar171 * 3.0;
      fVar172 = fVar172 * 3.0;
      fVar148 = (fVar206 * fVar177 + fVar148) - fVar131;
      fVar156 = (fVar206 * fVar204 + fVar156) - fVar132;
      fVar171 = (fVar177 * 3.0 - fVar171) * fVar209 + fVar171;
      fVar172 = (fVar204 * 3.0 - fVar172) * fVar209 + fVar172;
      auVar155._0_8_ = CONCAT44(fVar171,fVar148) ^ 0x80000000;
      auVar155._8_4_ = fVar171;
      auVar155._12_4_ = fVar171;
      fVar294 = (float)local_408._0_4_ - fVar206;
      fVar296 = (float)local_408._4_4_ - fVar209;
      fVar298 = fStack_400 - fVar212;
      fVar308 = fStack_3fc - fVar213;
      fVar309 = fStack_400 - fVar206;
      fVar310 = fStack_3fc - fVar209;
      fVar130 = fVar130 - fVar212;
      fVar106 = fVar106 - fVar213;
      fVar131 = fVar148 * fVar209 + fVar131;
      fVar132 = fVar156 * fVar209 + fVar132;
      auVar170._0_8_ = CONCAT44(fVar172,fVar156) ^ 0x8000000000000000;
      auVar170._8_4_ = -fVar172;
      auVar170._12_4_ = -fVar172;
      auVar96._0_4_ = fVar156 * fVar171 - fVar172 * fVar148;
      auVar96._4_4_ = auVar96._0_4_;
      auVar96._8_4_ = auVar96._0_4_;
      auVar96._12_4_ = auVar96._0_4_;
      auVar134 = divps(auVar170,auVar96);
      auVar68 = divps(auVar155,auVar96);
      fVar212 = auVar134._0_4_;
      fVar213 = auVar134._4_4_;
      fVar177 = auVar68._0_4_;
      fVar204 = auVar68._4_4_;
      fVar206 = fVar206 - (fVar132 * fVar177 + fVar131 * fVar212);
      fVar171 = fVar209 - (fVar132 * fVar204 + fVar131 * fVar213);
      fVar172 = fVar209 - (fVar132 * auVar68._8_4_ + fVar131 * auVar134._8_4_);
      fVar209 = fVar209 - (fVar132 * auVar68._12_4_ + fVar131 * auVar134._12_4_);
      auVar126._0_8_ = CONCAT44(fVar213 * fVar233,fVar213 * fVar273);
      auVar126._8_4_ = fVar213 * fVar276;
      auVar126._12_4_ = fVar213 * fVar241;
      auVar97._0_4_ = fVar213 * fVar214;
      auVar97._4_4_ = fVar213 * fVar261;
      auVar97._8_4_ = fVar213 * fVar230;
      auVar97._12_4_ = fVar213 * fVar242;
      auVar327._8_4_ = auVar126._8_4_;
      auVar327._0_8_ = auVar126._0_8_;
      auVar327._12_4_ = auVar126._12_4_;
      auVar136 = minps(auVar327,auVar97);
      auVar68 = maxps(auVar97,auVar126);
      auVar200._0_8_ = CONCAT44(fVar204 * fVar241,fVar204 * fVar276);
      auVar200._8_4_ = fVar204 * fVar281;
      auVar200._12_4_ = fVar204 * fVar292;
      auVar127._0_4_ = fVar204 * fVar230;
      auVar127._4_4_ = fVar204 * fVar242;
      auVar127._8_4_ = fVar204 * fVar256;
      auVar127._12_4_ = fVar204 * fVar104;
      auVar270._8_4_ = auVar200._8_4_;
      auVar270._0_8_ = auVar200._0_8_;
      auVar270._12_4_ = auVar200._12_4_;
      auVar120 = minps(auVar270,auVar127);
      auVar134 = maxps(auVar127,auVar200);
      fVar131 = 0.0 - (auVar134._0_4_ + auVar68._0_4_);
      fVar132 = 1.0 - (auVar134._4_4_ + auVar68._4_4_);
      fVar148 = 0.0 - (auVar134._8_4_ + auVar68._8_4_);
      fVar156 = 0.0 - (auVar134._12_4_ + auVar68._12_4_);
      fVar228 = 0.0 - (auVar120._0_4_ + auVar136._0_4_);
      fVar243 = 1.0 - (auVar120._4_4_ + auVar136._4_4_);
      fVar258 = 0.0 - (auVar120._8_4_ + auVar136._8_4_);
      fVar311 = 0.0 - (auVar120._12_4_ + auVar136._12_4_);
      auVar128._0_8_ = CONCAT44(fVar296 * fVar132,fVar294 * fVar131);
      auVar128._8_4_ = fVar298 * fVar148;
      auVar128._12_4_ = fVar308 * fVar156;
      auVar289._0_8_ = CONCAT44(fVar233 * fVar212,fVar273 * fVar212);
      auVar289._8_4_ = fVar276 * fVar212;
      auVar289._12_4_ = fVar241 * fVar212;
      auVar201._0_4_ = fVar212 * fVar214;
      auVar201._4_4_ = fVar212 * fVar261;
      auVar201._8_4_ = fVar212 * fVar230;
      auVar201._12_4_ = fVar212 * fVar242;
      auVar271._8_4_ = auVar289._8_4_;
      auVar271._0_8_ = auVar289._0_8_;
      auVar271._12_4_ = auVar289._12_4_;
      auVar134 = minps(auVar271,auVar201);
      auVar68 = maxps(auVar201,auVar289);
      auVar237._0_8_ = CONCAT44(fVar241 * fVar177,fVar276 * fVar177);
      auVar237._8_4_ = fVar281 * fVar177;
      auVar237._12_4_ = fVar292 * fVar177;
      auVar290._0_4_ = fVar177 * fVar230;
      auVar290._4_4_ = fVar177 * fVar242;
      auVar290._8_4_ = fVar177 * fVar256;
      auVar290._12_4_ = fVar177 * fVar104;
      auVar326._8_4_ = auVar237._8_4_;
      auVar326._0_8_ = auVar237._0_8_;
      auVar326._12_4_ = auVar237._12_4_;
      auVar136 = minps(auVar326,auVar290);
      auVar272._0_4_ = fVar294 * fVar228;
      auVar272._4_4_ = fVar296 * fVar243;
      auVar272._8_4_ = fVar298 * fVar258;
      auVar272._12_4_ = fVar308 * fVar311;
      auVar98._0_8_ = CONCAT44(fVar132 * fVar310,fVar131 * fVar309);
      auVar98._8_4_ = fVar148 * fVar130;
      auVar98._12_4_ = fVar156 * fVar106;
      auVar211._0_4_ = fVar228 * fVar309;
      auVar211._4_4_ = fVar243 * fVar310;
      auVar211._8_4_ = fVar258 * fVar130;
      auVar211._12_4_ = fVar311 * fVar106;
      auVar120 = maxps(auVar290,auVar237);
      fVar104 = 1.0 - (auVar120._0_4_ + auVar68._0_4_);
      fVar131 = 0.0 - (auVar120._4_4_ + auVar68._4_4_);
      fVar132 = 0.0 - (auVar120._8_4_ + auVar68._8_4_);
      fVar148 = 0.0 - (auVar120._12_4_ + auVar68._12_4_);
      fVar156 = 1.0 - (auVar136._0_4_ + auVar134._0_4_);
      fVar214 = 0.0 - (auVar136._4_4_ + auVar134._4_4_);
      fVar228 = 0.0 - (auVar136._8_4_ + auVar134._8_4_);
      fVar230 = 0.0 - (auVar136._12_4_ + auVar134._12_4_);
      auVar238._0_8_ = CONCAT44(fVar296 * fVar131,fVar294 * fVar104);
      auVar238._8_4_ = fVar298 * fVar132;
      auVar238._12_4_ = fVar308 * fVar148;
      auVar307._0_4_ = fVar294 * fVar156;
      auVar307._4_4_ = fVar296 * fVar214;
      auVar307._8_4_ = fVar298 * fVar228;
      auVar307._12_4_ = fVar308 * fVar230;
      auVar202._0_8_ = CONCAT44(fVar131 * fVar310,fVar104 * fVar309);
      auVar202._8_4_ = fVar132 * fVar130;
      auVar202._12_4_ = fVar148 * fVar106;
      auVar255._0_4_ = fVar156 * fVar309;
      auVar255._4_4_ = fVar214 * fVar310;
      auVar255._8_4_ = fVar228 * fVar130;
      auVar255._12_4_ = fVar230 * fVar106;
      auVar291._8_4_ = auVar238._8_4_;
      auVar291._0_8_ = auVar238._0_8_;
      auVar291._12_4_ = auVar238._12_4_;
      auVar68 = minps(auVar291,auVar307);
      auVar316._8_4_ = auVar202._8_4_;
      auVar316._0_8_ = auVar202._0_8_;
      auVar316._12_4_ = auVar202._12_4_;
      auVar317 = minps(auVar316,auVar255);
      auVar250 = minps(auVar68,auVar317);
      auVar134 = maxps(auVar307,auVar238);
      auVar68 = maxps(auVar255,auVar202);
      auVar120 = maxps(auVar68,auVar134);
      auVar239._8_4_ = auVar128._8_4_;
      auVar239._0_8_ = auVar128._0_8_;
      auVar239._12_4_ = auVar128._12_4_;
      auVar134 = minps(auVar239,auVar272);
      auVar203._8_4_ = auVar98._8_4_;
      auVar203._0_8_ = auVar98._0_8_;
      auVar203._12_4_ = auVar98._12_4_;
      auVar68 = minps(auVar203,auVar211);
      auVar134 = minps(auVar134,auVar68);
      auVar136 = maxps(auVar272,auVar128);
      auVar68 = maxps(auVar211,auVar98);
      auVar68 = maxps(auVar68,auVar136);
      auVar240._0_4_ = auVar250._4_4_ + auVar250._0_4_ + fVar206;
      auVar240._4_4_ = auVar134._4_4_ + auVar134._0_4_ + fVar171;
      auVar240._8_4_ = auVar250._8_4_ + auVar250._4_4_ + fVar172;
      auVar240._12_4_ = auVar250._12_4_ + auVar134._4_4_ + fVar209;
      fVar104 = auVar120._4_4_ + auVar120._0_4_ + fVar206;
      fVar106 = auVar68._4_4_ + auVar68._0_4_ + fVar171;
      auVar99._4_4_ = fVar106;
      auVar99._0_4_ = fVar104;
      auVar134 = maxps(_local_408,auVar240);
      auVar99._8_4_ = auVar120._8_4_ + auVar120._4_4_ + fVar172;
      auVar99._12_4_ = auVar120._12_4_ + auVar68._4_4_ + fVar209;
      auVar68 = minps(auVar99,auVar227);
      iVar61 = -(uint)(auVar68._0_4_ < auVar134._0_4_);
      iVar63 = -(uint)(auVar68._4_4_ < auVar134._4_4_);
      auVar101._4_4_ = iVar63;
      auVar101._0_4_ = iVar61;
      auVar101._8_4_ = iVar63;
      auVar101._12_4_ = iVar63;
      auVar100._8_8_ = auVar101._8_8_;
      auVar100._4_4_ = iVar61;
      auVar100._0_4_ = iVar61;
      iVar61 = movmskpd((uint)(fVar143 < 0.0),auVar100);
      if (iVar61 == 0) {
        bVar51 = 0;
        if (((float)local_408._0_4_ < auVar240._0_4_) && (fVar104 < fStack_400)) {
          bVar51 = -(fVar106 < fStack_3fc) & (float)local_408._4_4_ < auVar240._4_4_;
        }
        bVar51 = bVar59 | bVar51;
        uVar53 = (ulong)CONCAT31(uVar25,bVar51);
        if (bVar51 != 1) goto LAB_00b51f01;
        uVar53 = 200;
        do {
          fVar104 = 1.0 - fVar206;
          fVar132 = fVar206 * fVar206 * fVar206;
          fVar131 = fVar206 * fVar206 * 3.0 * fVar104;
          fVar106 = fVar104 * fVar104 * fVar104;
          fVar143 = fVar206 * 3.0 * fVar104 * fVar104;
          fVar130 = fVar106 * (float)local_1f8 +
                    fVar143 * local_288 + fVar131 * (float)local_298 + fVar132 * fVar157;
          fVar104 = fVar106 * local_1f8._4_4_ +
                    fVar143 * fStack_284 + fVar131 * local_298._4_4_ + fVar132 * fVar158;
          fVar130 = ((fVar106 * fStack_1f0 +
                     fVar143 * (float)uStack_280 + fVar131 * fStack_290 + fVar132 * fVar105) -
                    fVar130) * fVar171 + fVar130;
          fVar104 = ((fVar106 * fStack_1ec +
                     fVar143 * uStack_280._4_4_ + fVar131 * fStack_28c + fVar132 * fVar67) - fVar104
                    ) * fVar171 + fVar104;
          fVar206 = fVar206 - (fVar104 * fVar177 + fVar130 * fVar212);
          fVar171 = fVar171 - (fVar104 * fVar204 + fVar130 * fVar213);
          fVar130 = (float)((uint)fVar130 & (uint)DAT_01f7b6c0);
          fVar104 = (float)((uint)fVar104 & DAT_01f7b6c0._4_4_);
          if (fVar104 <= fVar130) {
            fVar104 = fVar130;
          }
          auVar317 = _DAT_01f7b6c0;
          if (fVar104 < fVar145) {
            if ((((0.0 <= fVar206) && (fVar206 <= 1.0)) && (0.0 <= fVar171)) && (fVar171 <= 1.0)) {
              fVar104 = (pre->ray_space).vx.field_0.m128[2];
              fVar106 = (pre->ray_space).vy.field_0.m128[2];
              fVar130 = (pre->ray_space).vz.field_0.m128[2];
              fVar131 = (ray->org).field_0.m128[0];
              fVar132 = (ray->org).field_0.m128[1];
              fVar143 = (ray->org).field_0.m128[2];
              fVar209 = 1.0 - fVar171;
              fVar204 = 1.0 - fVar206;
              fVar148 = fVar204 * fVar204 * fVar204;
              fVar156 = fVar206 * 3.0 * fVar204 * fVar204;
              fVar177 = fVar206 * fVar206 * fVar206;
              fVar172 = fVar206 * fVar206 * 3.0 * fVar204;
              fVar104 = (((fStack_360 - fVar143) * fVar130 +
                         (fStack_364 - fVar132) * fVar106 + (local_368 - fVar131) * fVar104) *
                         fVar209 +
                        ((fStack_350 - fVar143) * fVar130 +
                        (fStack_354 - fVar132) * fVar106 + (local_358 - fVar131) * fVar104) *
                        fVar171) * fVar148 +
                        (((fStack_370 - fVar143) * fVar130 +
                         (fStack_374 - fVar132) * fVar106 + (local_378 - fVar131) * fVar104) *
                         fVar209 +
                        ((fStack_340 - fVar143) * fVar130 +
                        (fStack_344 - fVar132) * fVar106 + (local_348 - fVar131) * fVar104) *
                        fVar171) * fVar156 +
                        (((fStack_390 - fVar143) * fVar130 +
                         (fStack_394 - fVar132) * fVar106 + (local_398 - fVar131) * fVar104) *
                         fVar209 +
                        ((fStack_3b0 - fVar143) * fVar130 +
                        (fStack_3b4 - fVar132) * fVar106 + (local_3b8 - fVar131) * fVar104) *
                        fVar171) * fVar172 +
                        (fVar209 * ((fStack_380 - fVar143) * fVar130 +
                                   (fStack_384 - fVar132) * fVar106 +
                                   (local_388 - fVar131) * fVar104) +
                        ((fStack_200 - fVar143) * fVar130 +
                        (fStack_204 - fVar132) * fVar106 + (local_208 - fVar131) * fVar104) *
                        fVar171) * fVar177;
              if ((ray->org).field_0.m128[3] <= fVar104) {
                fVar106 = ray->tfar;
                auVar317 = ZEXT416((uint)fVar106);
                if (fVar104 <= fVar106) {
                  fVar143 = 1.0 - fVar171;
                  fVar209 = 1.0 - fVar171;
                  fVar212 = 1.0 - fVar171;
                  fVar130 = local_378 * fVar143 + local_348 * fVar171;
                  fVar131 = fStack_374 * fVar209 + fStack_344 * fVar171;
                  fVar132 = fStack_370 * fVar212 + fStack_340 * fVar171;
                  fVar213 = local_398 * fVar143 + local_3b8 * fVar171;
                  fVar228 = fStack_394 * fVar209 + fStack_3b4 * fVar171;
                  fVar243 = fStack_390 * fVar212 + fStack_3b0 * fVar171;
                  fVar214 = fVar213 - fVar130;
                  fVar230 = fVar228 - fVar131;
                  fVar256 = fVar243 - fVar132;
                  fVar130 = (((fVar130 - (local_368 * fVar143 + local_358 * fVar171)) * fVar204 +
                             fVar206 * fVar214) * fVar204 +
                            (fVar214 * fVar204 +
                            ((fVar143 * local_388 + fVar171 * local_208) - fVar213) * fVar206) *
                            fVar206) * 3.0;
                  fVar131 = (((fVar131 - (fStack_364 * fVar209 + fStack_354 * fVar171)) * fVar204 +
                             fVar206 * fVar230) * fVar204 +
                            (fVar230 * fVar204 +
                            ((fVar209 * fStack_384 + fVar171 * fStack_204) - fVar228) * fVar206) *
                            fVar206) * 3.0;
                  fVar132 = (((fVar132 - (fStack_360 * fVar212 + fStack_350 * fVar171)) * fVar204 +
                             fVar206 * fVar256) * fVar204 +
                            (fVar256 * fVar204 +
                            ((fVar212 * fStack_380 + fVar171 * fStack_200) - fVar243) * fVar206) *
                            fVar206) * 3.0;
                  pGVar14 = (context->scene->geometries).items[local_330].ptr;
                  if ((pGVar14->mask & ray->mask) == 0) {
LAB_00b535c4:
                    uVar53 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (uVar53 = CONCAT71((int7)((ulong)context->args >> 8),1),
                          pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar143 = fVar148 * local_178 +
                              fVar156 * local_188 + fVar172 * local_198 + fVar177 * local_1a8;
                    fVar204 = fVar148 * fStack_174 +
                              fVar156 * fStack_184 + fVar172 * fStack_194 + fVar177 * fStack_1a4;
                    fVar148 = fVar148 * fStack_170 +
                              fVar156 * fStack_180 + fVar172 * fStack_190 + fVar177 * fStack_1a0;
                    local_1d8 = CONCAT44(fVar143 * fVar132 - fVar130 * fVar148,
                                         fVar148 * fVar131 - fVar132 * fVar204);
                    local_1d0 = fVar204 * fVar130 - fVar131 * fVar143;
                    local_1cc = fVar206;
                    fStack_1c8 = fVar171;
                    local_1c4 = (int)local_278;
                    local_1c0 = (int)local_330;
                    local_1bc = context->user->instID[0];
                    local_1b8 = context->user->instPrimID[0];
                    ray->tfar = fVar104;
                    local_3bc = 0xffffffff;
                    local_268.valid = &local_3bc;
                    local_268.geometryUserPtr = pGVar14->userPtr;
                    local_268.context = context->user;
                    local_268.hit = (RTCHitN *)&local_1d8;
                    local_268.N = 1;
                    local_3a8._0_4_ = (int)uVar58;
                    local_268.ray = (RTCRayN *)ray;
                    if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar14->occlusionFilterN)(&local_268);
                      uVar58 = (ulong)(uint)local_3a8._0_4_;
                      if (*local_268.valid != 0) goto LAB_00b5356a;
LAB_00b535b9:
                      ray->tfar = fVar106;
                      goto LAB_00b535c4;
                    }
LAB_00b5356a:
                    p_Var54 = context->args->filter;
                    if ((p_Var54 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var54)(&local_268);
                      uVar58 = (ulong)(uint)local_3a8._0_4_;
                      p_Var54 = (RTCFilterFunctionN)local_268.valid;
                      if (*local_268.valid == 0) goto LAB_00b535b9;
                    }
                    uVar53 = CONCAT71((int7)((ulong)p_Var54 >> 8),1);
                  }
                  uVar58 = CONCAT71((int7)(uVar58 >> 8),(byte)uVar58 | (byte)uVar53);
                }
              }
            }
            break;
          }
          uVar53 = uVar53 - 1;
        } while (uVar53 != 0);
      }
    }
  }
  goto LAB_00b52573;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }